

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

transformations_t *
opengv::absolute_pose::upnp
          (transformations_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,Indices *indices)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  iterator iVar3;
  pointer pMVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [56];
  int iVar101;
  int iVar102;
  size_t sVar103;
  double *pdVar104;
  Index outer;
  long lVar105;
  ulong uVar106;
  int iVar107;
  double dVar108;
  long lVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  double dVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  double dVar217;
  double dVar222;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 in_ZMM7 [64];
  double dVar223;
  double dVar226;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  double dVar230;
  double dVar232;
  undefined1 auVar231 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar233 [64];
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  vector<double,_std::allocator<double>_> characteristicPolynomial;
  Matrix<double,_3,_1,_0,_3,_1> J;
  Matrix<double,_3,_1,_0,_3,_1> v_2;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  quaternions1;
  Matrix<double,_3,_1,_0,_3,_1> p_1;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  quaternions2;
  type tmp;
  Matrix<double,_3,_1,_0,_3,_1> v;
  Matrix<double,_1,_10,_1,_1,_10> C_cay;
  Matrix<double,_3,_1,_0,_3,_1> v_3;
  Matrix<double,_3,_3,_0,_3,_3> H;
  Matrix<double,_1,_10,_1,_1,_10> C;
  quaternion_t q;
  Vector3d cay;
  vector<double,_std::allocator<double>_> roots;
  Matrix<double,_10,_10,_0,_10,_10> M_cay;
  Matrix<double,_10,_10,_0,_10,_10> M;
  double local_11c0;
  double dStack_11b8;
  double local_11b0;
  double dStack_11a8;
  undefined1 local_11a0 [8];
  double dStack_1198;
  vector<double,_std::allocator<double>_> local_1190;
  double local_1170;
  double dStack_1168;
  double local_1160;
  double dStack_1158;
  double local_1150;
  undefined1 local_1140 [16];
  double adStack_1130 [2];
  undefined1 local_1120 [16];
  double dStack_1110;
  double dStack_1108;
  double local_1100;
  double dStack_10f8;
  double local_10f0;
  double dStack_10e8;
  double dStack_10e0;
  undefined1 auStack_10d8 [16];
  double dStack_10c8;
  undefined8 local_10c0;
  undefined1 auStack_10b8 [16];
  double dStack_10a8;
  undefined8 local_10a0;
  undefined1 auStack_1098 [16];
  double dStack_1088;
  undefined8 local_1080;
  double dStack_1078;
  double local_1070;
  undefined8 uStack_1068;
  double local_1060;
  undefined8 uStack_1058;
  double local_1050;
  undefined8 uStack_1048;
  double local_1040;
  double dStack_1038;
  undefined1 local_1030 [16];
  undefined1 local_1020 [16];
  double local_1010;
  double dStack_1008;
  double local_1000;
  double dStack_ff8;
  double local_ff0;
  double dStack_fe8;
  undefined1 local_fe0 [56];
  double dStack_fa8;
  double local_fa0;
  double local_f80;
  double dStack_f78;
  double dStack_f70;
  double dStack_f68;
  double local_f60;
  double dStack_f58;
  double dStack_f50;
  double dStack_f48;
  double local_f40;
  double dStack_f38;
  double dStack_f30;
  double dStack_f28;
  double local_f20;
  double dStack_f18;
  double dStack_f10;
  double dStack_f08;
  double local_f00;
  double dStack_ef8;
  double dStack_ef0;
  double dStack_ee8;
  double local_ed0;
  double dStack_ec8;
  double local_ec0;
  double dStack_eb8;
  double local_eb0;
  double dStack_ea8;
  double local_ea0;
  double dStack_e98;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_e90;
  double adStack_e78 [4];
  undefined1 auStack_e58 [16];
  double dStack_e48;
  double dStack_e40;
  double dStack_e38;
  double local_e30;
  undefined1 local_e20 [32];
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_e00;
  double local_de0;
  double dStack_dd8;
  double local_dd0 [2];
  undefined1 local_dc0 [24];
  undefined1 auStack_da8 [16];
  double dStack_d98;
  undefined1 auStack_d90 [16];
  double local_d80;
  undefined1 auStack_d78 [16];
  double *pdStack_d68;
  double local_d60;
  double dStack_d58;
  double dStack_d50;
  double dStack_d48;
  double local_d40;
  double dStack_d38;
  double dStack_d30;
  double dStack_d28;
  double local_d20;
  double dStack_d18;
  double dStack_d10;
  double dStack_d08;
  double local_d00;
  double dStack_cf8;
  double dStack_cf0;
  double dStack_ce8;
  double local_ce0;
  double dStack_cd8;
  double dStack_cd0;
  double dStack_cc8;
  undefined1 *local_cc0;
  undefined1 *puStack_cb8;
  double dStack_cb0;
  double dStack_ca8;
  double local_ca0;
  double dStack_c98;
  double dStack_c90;
  double dStack_c88;
  double local_c80;
  double dStack_c78;
  double dStack_c70;
  double dStack_c68;
  double local_c60;
  double dStack_c58;
  double dStack_c50;
  double dStack_c48;
  double local_c40;
  double dStack_c38;
  double dStack_c30;
  double dStack_c28;
  double local_c20;
  double dStack_c18;
  double dStack_c10;
  double dStack_c08;
  double local_c00;
  double dStack_bf8;
  double dStack_bf0;
  double dStack_be8;
  double local_be0;
  double dStack_bd8;
  double dStack_bd0;
  double dStack_bc8;
  double local_bc0;
  double dStack_bb8;
  double dStack_bb0;
  double dStack_ba8;
  double local_ba0;
  double dStack_b98;
  double dStack_b90;
  double dStack_b88;
  double local_b80;
  double dStack_b78;
  double dStack_b70;
  double dStack_b68;
  double local_b60;
  double dStack_b58;
  double dStack_b50;
  double dStack_b48;
  double local_b40;
  double dStack_b38;
  double dStack_b30;
  double dStack_b28;
  double local_b20;
  double dStack_b18;
  double dStack_b10;
  double dStack_b08;
  double local_b00;
  double dStack_af8;
  double dStack_af0;
  double dStack_ae8;
  double local_ae0;
  double dStack_ad8;
  double dStack_ad0;
  double dStack_ac8;
  double local_ac0;
  double dStack_ab8;
  double adStack_ab0 [2];
  undefined1 local_aa0 [24];
  Matrix<double,_3,_3,_0,_3,_3> *pMStack_a88;
  double dStack_a80;
  double dStack_a78;
  double dStack_a70;
  double dStack_a68;
  double dStack_a60;
  double dStack_a58;
  double local_9b0;
  double dStack_9a8;
  double local_9a0;
  double dStack_998;
  double local_990;
  double dStack_988;
  Matrix<double,_1,_10,_1,_1,_10> local_980;
  double local_910;
  undefined8 uStack_908;
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [8];
  ulong local_8c8;
  undefined1 local_8c0 [48];
  double dStack_890;
  double dStack_888;
  double local_880;
  undefined1 local_870 [16];
  double local_860;
  undefined1 local_850 [64];
  double local_810;
  Matrix<double,_1,_10,_1,_1,_10> local_800;
  quaternion_t local_780;
  undefined1 local_760 [16];
  double local_750;
  undefined8 uStack_748;
  double local_740;
  double dStack_738;
  undefined1 local_730 [16];
  double local_720;
  vector<double,_std::allocator<double>_> local_718;
  Matrix<double,_10,_10,_0,_10,_10> local_700;
  Matrix<double,_10,_10,_0,_10,_10> local_3e0;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  double local_80;
  
  auVar111 = in_ZMM11._0_16_;
  auVar110 = in_ZMM7._0_16_;
  sVar103 = indices->_numberCorrespondences;
  local_ea0 = 0.0;
  dStack_e98 = 0.0;
  if ((int)sVar103 < 1) {
    dVar108 = 0.0;
    auVar113 = ZEXT816(0);
    auVar193 = ZEXT816(0);
    auVar112 = ZEXT816(0);
    auVar206 = ZEXT816(0);
  }
  else {
    auVar112 = ZEXT816(0);
    dVar108 = 0.0;
    lVar109 = 0;
    auVar193 = ZEXT816(0);
    auVar113 = ZEXT816(0);
    auVar206 = ZEXT816(0);
    do {
      local_e20 = ZEXT1632(auVar206);
      _local_1140 = ZEXT1632(auVar193);
      iVar101 = (int)lVar109;
      iVar107 = iVar101;
      if (indices->_useIndices == true) {
        iVar107 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar109];
      }
      in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
      in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
      (*adapter->_vptr_AbsoluteAdapterBase[5])(local_dc0,adapter,(long)iVar107);
      if (indices->_useIndices == true) {
        iVar101 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar109];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_700,adapter,(long)iVar101);
      auVar111 = in_ZMM11._0_16_;
      auVar110 = in_ZMM7._0_16_;
      auVar115._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[0] * (double)local_dc0._0_8_;
      auVar115._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[0] * (double)local_dc0._8_8_;
      auVar142._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[1];
      auVar142._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[1];
      auVar193 = vfmadd231pd_fma(auVar115,auVar142,auStack_da8);
      auVar169._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2];
      auVar169._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2];
      auVar193 = vfmadd231pd_fma(auVar193,auVar169,auStack_d90);
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0] = (double)auVar193._0_8_;
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[1] = (double)auVar193._8_8_;
      dVar114 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[0] * (double)local_dc0._16_8_ +
                local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[1] * dStack_d98 +
                local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[2] * local_d80;
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[2] = dVar114;
      pdVar104 = (double *)(local_dc0 + 0x10);
      lVar105 = 0;
      do {
        dVar217 = local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                  m_storage.m_data.array[lVar105];
        pdVar104[-2] = auVar193._0_8_ * dVar217;
        auVar100 = stack0xfffffffffffff248;
        pdVar104[-1] = auVar193._8_8_ * dVar217;
        *pdVar104 = dVar114 * dVar217;
        lVar105 = lVar105 + 1;
        pdVar104 = pdVar104 + 3;
      } while (lVar105 != 3);
      auVar206._0_8_ = (double)local_e20._0_8_ + (double)local_dc0._0_8_;
      auVar206._8_8_ = (double)local_e20._8_8_ + (double)local_dc0._8_8_;
      local_11b0 = auVar113._0_8_;
      dStack_11a8 = auVar113._8_8_;
      auVar113._0_8_ = local_11b0 + (double)local_dc0._16_8_;
      auVar113._8_8_ = dStack_11a8 + (double)auStack_da8._0_8_;
      auVar193._0_8_ = (double)local_1140._0_8_ + (double)auStack_da8._8_8_;
      auVar193._8_8_ = (double)local_1140._8_8_ + dStack_d98;
      local_11c0 = auVar112._0_8_;
      dStack_11b8 = auVar112._8_8_;
      auVar112._0_8_ = local_11c0 + (double)auStack_d90._0_8_;
      auVar112._8_8_ = dStack_11b8 + (double)auStack_d90._8_8_;
      dVar108 = dVar108 + local_d80;
      lVar109 = lVar109 + 1;
      sVar103 = indices->_numberCorrespondences;
      unique0x1000a4d4 = auVar100;
    } while (lVar109 < (int)sVar103);
  }
  auVar110 = vcvtusi2sd_avx512f(auVar110,sVar103);
  local_80 = auVar110._0_8_;
  auVar167._16_16_ = auVar113;
  auVar167._0_16_ = auVar206;
  local_c0 = vsubpd_avx(ZEXT832((ulong)local_80),auVar167);
  auVar168._16_16_ = auVar112;
  auVar168._0_16_ = auVar193;
  local_a0 = vsubpd_avx(ZEXT832((ulong)local_80),auVar168);
  local_80 = local_80 - dVar108;
  local_dc0._0_8_ = local_c0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_0,_3,_3> *)local_850,(SrcXprType *)local_dc0,
        (assign_op<double,_double> *)&local_3e0);
  local_f00 = 0.0;
  dStack_ef8 = 0.0;
  dStack_ef0 = 0.0;
  dStack_ee8 = 0.0;
  local_f20 = 0.0;
  dStack_f18 = 0.0;
  dStack_f10 = 0.0;
  dStack_f08 = 0.0;
  local_f40 = 0.0;
  dStack_f38 = 0.0;
  dStack_f30 = 0.0;
  dStack_f28 = 0.0;
  local_f60 = 0.0;
  dStack_f58 = 0.0;
  dStack_f50 = 0.0;
  dStack_f48 = 0.0;
  local_f80 = 0.0;
  dStack_f78 = 0.0;
  dStack_f70 = 0.0;
  dStack_f68 = 0.0;
  local_1160 = 0.0;
  dStack_1158 = 0.0;
  local_1150 = 0.0;
  local_ed0 = 0.0;
  dStack_ec8 = 0.0;
  local_ec0 = 0.0;
  dStack_eb8 = 0.0;
  local_eb0 = 0.0;
  dStack_ea8 = 0.0;
  local_1030._0_8_ = 0.0;
  local_1030._8_8_ = 0.0;
  dVar108 = 0.0;
  dVar114 = 0.0;
  if (0 < (int)indices->_numberCorrespondences) {
    auVar110 = ZEXT816(0);
    dVar240 = 0.0;
    dVar241 = 0.0;
    dVar238 = 0.0;
    dVar239 = 0.0;
    dVar236 = 0.0;
    dVar237 = 0.0;
    dVar234 = 0.0;
    dVar235 = 0.0;
    auVar111 = ZEXT816(0);
    dVar230 = 0.0;
    dVar232 = 0.0;
    auVar227 = ZEXT816(0);
    dVar223 = 0.0;
    dVar226 = 0.0;
    dVar217 = 0.0;
    dVar222 = 0.0;
    local_ea0 = 0.0;
    dStack_e98 = 0.0;
    local_ed0 = 0.0;
    dStack_ec8 = 0.0;
    local_ec0 = 0.0;
    dStack_eb8 = 0.0;
    local_eb0 = 0.0;
    dStack_ea8 = 0.0;
    lVar109 = 0;
    do {
      local_e20._0_16_ = auVar111;
      local_1140 = auVar227;
      iVar101 = (int)lVar109;
      iVar107 = iVar101;
      if (indices->_useIndices == true) {
        iVar107 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar109];
      }
      local_1170 = dVar234;
      dStack_1168 = dVar235;
      local_1020 = auVar110;
      local_1010 = dVar240;
      dStack_1008 = dVar241;
      local_1000 = dVar238;
      dStack_ff8 = dVar239;
      local_ff0 = dVar236;
      dStack_fe8 = dVar237;
      (*adapter->_vptr_AbsoluteAdapterBase[5])(local_dc0,adapter,(long)iVar107);
      iVar107 = iVar101;
      if (indices->_useIndices == true) {
        iVar107 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar109];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_3e0,adapter,(long)iVar107);
      auVar122._0_8_ =
           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[0] * (double)local_dc0._0_8_;
      auVar122._8_8_ =
           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[0] * (double)local_dc0._8_8_;
      auVar143._8_8_ =
           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[1];
      auVar143._0_8_ =
           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[1];
      auVar111 = vfmadd231pd_fma(auVar122,auVar143,auStack_da8);
      auVar170._8_8_ =
           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2];
      auVar170._0_8_ =
           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2];
      auVar111 = vfmadd231pd_fma(auVar111,auVar170,auStack_d90);
      dVar108 = local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[0] * (double)local_dc0._16_8_ +
                local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[1] * dStack_d98 +
                local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[2] * local_d80;
      dVar114 = auVar111._0_8_;
      local_dc0._8_8_ = dVar114 * dVar114 + -1.0;
      local_dc0._0_8_ = local_850;
      auVar111 = vshufpd_avx(auVar111,auVar111,1);
      dVar234 = auVar111._0_8_;
      local_dc0._16_8_ = dVar114 * dVar234;
      auStack_da8._0_8_ = dVar108 * dVar114;
      auStack_da8._8_8_ = dVar114 * dVar234;
      dStack_d98 = dVar234 * dVar234 + -1.0;
      auStack_d90._0_8_ = dVar108 * dVar234;
      auStack_d90._8_8_ = dVar108 * dVar114;
      local_d80 = dVar108 * dVar234;
      auStack_d78._8_8_ = local_850;
      auStack_d78._0_8_ = dVar108 * dVar108 + -1.0;
      pdStack_d68 = (double *)(local_dc0 + 8);
      local_d60 = 1.48219693752374e-323;
      auVar110._8_8_ = local_850._24_8_;
      auVar110._0_8_ = local_850._16_8_;
      auVar94._8_8_ = local_850._32_8_;
      auVar94._0_8_ = local_850._24_8_;
      auVar111 = vmovhpd_avx(auVar110,local_850._40_8_);
      lVar105 = 0x18;
      do {
        dVar108 = *(double *)(local_dc0 + lVar105);
        auVar194._8_8_ = dVar108;
        auVar194._0_8_ = dVar108;
        auVar5._8_8_ = *(undefined8 *)((long)local_dd0 + lVar105);
        auVar5._0_8_ = *(undefined8 *)((long)local_dd0 + lVar105);
        auVar110 = vmulpd_avx512vl(local_850._0_16_,auVar5);
        auVar6._8_8_ = *(undefined8 *)(local_dc0 + lVar105 + -8);
        auVar6._0_8_ = *(undefined8 *)(local_dc0 + lVar105 + -8);
        auVar110 = vfmadd231pd_avx512vl(auVar110,auVar94,auVar6);
        auVar110 = vfmadd231pd_fma(auVar110,local_850._48_16_,auVar194);
        *(undefined1 (*) [16])
         ((long)local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array + lVar105 + -0x18) = auVar110;
        auVar207._0_8_ = auVar111._0_8_ * *(double *)((long)local_dd0 + lVar105);
        auVar207._8_8_ = auVar111._8_8_ * *(double *)(local_dc0 + lVar105 + -8);
        auVar110 = vshufpd_avx(auVar207,auVar207,1);
        *(double *)
         ((long)local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array + lVar105 + -8) =
             auVar207._0_8_ + auVar110._0_8_ + dVar108 * local_810;
        lVar105 = lVar105 + 0x18;
      } while (lVar105 != 0x60);
      iVar107 = iVar101;
      if (indices->_useIndices == true) {
        iVar107 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar109];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_700,adapter,(long)iVar107);
      if (indices->_useIndices == true) {
        iVar101 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar109];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[4])(local_aa0,adapter,(long)iVar101);
      dVar108 = local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[8];
      auVar112 = (undefined1  [16])
                 local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array._0_16_;
      dStack_1108 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0];
      auVar123._0_8_ =
           -local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0];
      auVar123._8_8_ = 0x8000000000000000;
      local_10f0 = (double)vmovlpd_avx(auVar123);
      auStack_10d8._0_8_ = vmovlpd_avx(auVar123);
      local_10c0 = 0;
      uStack_1048 = 0;
      local_10a0 = 0;
      dStack_1088 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0] +
                    local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0];
      local_1070 = dStack_1088;
      uStack_1058 = 0;
      dStack_10a8 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[2] +
                    local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[2];
      local_1060 = dStack_10a8;
      dStack_10e8 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[1];
      dStack_10e0 = -local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                     m_storage.m_data.array[2];
      auStack_10d8._8_8_ =
           -local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[1];
      dStack_10c8 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[2];
      local_1040 = dStack_10a8;
      local_1120._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[1];
      local_1120._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[0];
      dStack_1110 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[2];
      local_1100 = -local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[1];
      dStack_10f8 = -local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                     m_storage.m_data.array[2];
      auVar144._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[1] * 2.0;
      auVar144._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2] * -2.0;
      dStack_1078 = (double)vmovlpd_avx(auVar144);
      auStack_10b8 = vshufpd_avx(auVar144,auVar144,1);
      auStack_1098._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[1] * -2.0;
      auStack_1098._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[0] * -2.0;
      local_1080 = 0;
      uStack_1068 = 0;
      local_1050 = dStack_1088;
      dStack_1038 = (double)vmovlpd_avx(auVar144);
      auVar97._8_8_ =
           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[3];
      auVar97._0_8_ =
           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2];
      auVar98._8_8_ =
           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[4];
      auVar98._0_8_ =
           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[3];
      auVar99._8_8_ =
           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[7];
      auVar99._0_8_ =
           local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[6];
      auVar113 = vmovhpd_avx(auVar97,local_3e0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>
                                     .m_storage.m_data.array[5]);
      lVar105 = 0x10;
      do {
        dVar114 = *(double *)(local_1120 + lVar105);
        auVar195._8_8_ = dVar114;
        auVar195._0_8_ = dVar114;
        auVar7._8_8_ = *(undefined8 *)(local_1140 + lVar105 + 0x10);
        auVar7._0_8_ = *(undefined8 *)(local_1140 + lVar105 + 0x10);
        auVar111 = vmulpd_avx512vl(auVar112,auVar7);
        auVar8._8_8_ = *(undefined8 *)(local_1140 + lVar105 + 0x18);
        auVar8._0_8_ = *(undefined8 *)(local_1140 + lVar105 + 0x18);
        auVar111 = vfmadd231pd_avx512vl(auVar111,auVar98,auVar8);
        auVar111 = vfmadd231pd_fma(auVar111,auVar99,auVar195);
        *(undefined1 (*) [16])((long)local_dd0 + lVar105) = auVar111;
        auVar208._0_8_ = auVar113._0_8_ * *(double *)(local_1140 + lVar105 + 0x10);
        auVar208._8_8_ = auVar113._8_8_ * *(double *)(local_1140 + lVar105 + 0x18);
        auVar111 = vshufpd_avx(auVar208,auVar208,1);
        *(double *)(local_dc0 + lVar105) = auVar208._0_8_ + auVar111._0_8_ + dVar108 * dVar114;
        lVar105 = lVar105 + 0x18;
      } while (lVar105 != 0x100);
      local_ea0 = local_ea0 + (double)local_dc0._0_8_;
      dStack_e98 = dStack_e98 + (double)local_dc0._8_8_;
      auVar110 = vaddpd_avx512vl(local_1020,stack0xfffffffffffff250);
      dVar240 = local_1010 + (double)auStack_da8._8_8_;
      dVar241 = dStack_1008 + dStack_d98;
      local_ed0 = local_ed0 + (double)auStack_d90._0_8_;
      dStack_ec8 = dStack_ec8 + (double)auStack_d90._8_8_;
      dVar238 = local_1000 + local_d80;
      dVar239 = dStack_ff8 + (double)auStack_d78._0_8_;
      dVar236 = local_ff0 + (double)auStack_d78._8_8_;
      dVar237 = dStack_fe8 + (double)pdStack_d68;
      local_ec0 = local_ec0 + local_d60;
      dStack_eb8 = dStack_eb8 + dStack_d58;
      dVar234 = local_1170 + dStack_d50;
      dVar235 = dStack_1168 + dStack_d48;
      auVar111._0_8_ = (double)local_e20._0_8_ + local_d40;
      auVar111._8_8_ = (double)local_e20._8_8_ + dStack_d38;
      local_eb0 = local_eb0 + dStack_d30;
      dStack_ea8 = dStack_ea8 + dStack_d28;
      dVar230 = dVar230 + local_d20;
      dVar232 = dVar232 + dStack_d18;
      auVar227._0_8_ = (double)local_1140._0_8_ + dStack_d10;
      auVar227._8_8_ = (double)local_1140._8_8_ + dStack_d08;
      local_1030._0_8_ = (double)local_1030._0_8_ + local_d00;
      local_1030._8_8_ = (double)local_1030._8_8_ + dStack_cf8;
      dVar223 = dVar223 + dStack_cf0;
      dVar226 = dVar226 + dStack_ce8;
      dVar217 = dVar217 + local_ce0;
      dVar222 = dVar222 + dStack_cd8;
      auVar196._8_8_ = local_aa0._16_8_;
      auVar196._0_8_ = local_aa0._16_8_;
      auVar9._8_8_ = local_aa0._0_8_;
      auVar9._0_8_ = local_aa0._0_8_;
      auVar112 = vmulpd_avx512vl(auVar112,auVar9);
      auVar10._8_8_ = local_aa0._8_8_;
      auVar10._0_8_ = local_aa0._8_8_;
      auVar112 = vfmadd231pd_avx512vl(auVar112,auVar98,auVar10);
      auVar112 = vfmadd213pd_fma(auVar99,auVar196,auVar112);
      auVar145._0_8_ = auVar113._0_8_ * (double)local_aa0._0_8_;
      auVar145._8_8_ = auVar113._8_8_ * (double)local_aa0._8_8_;
      auVar113 = vshufpd_avx(auVar145,auVar145,1);
      local_1160 = auVar112._0_8_ + local_1160;
      dStack_1158 = auVar112._8_8_ + dStack_1158;
      local_1150 = auVar145._0_8_ + auVar113._0_8_ + dVar108 * (double)local_aa0._16_8_ + local_1150
      ;
      lVar109 = lVar109 + 1;
    } while (lVar109 < (int)indices->_numberCorrespondences);
    local_f00 = auVar110._0_8_;
    dStack_ef8 = auVar110._8_8_;
    dVar108 = (double)local_1030._0_8_;
    dVar114 = (double)local_1030._8_8_;
    local_f80 = dVar223;
    dStack_f78 = dVar226;
    dStack_f70 = dVar217;
    dStack_f68 = dVar222;
    local_f60 = dVar230;
    dStack_f58 = dVar232;
    dStack_f50 = auVar227._0_8_;
    dStack_f48 = auVar227._8_8_;
    local_f40 = dVar234;
    dStack_f38 = dVar235;
    dStack_f30 = auVar111._0_8_;
    dStack_f28 = auVar111._8_8_;
    local_f20 = dVar238;
    dStack_f18 = dVar239;
    dStack_f10 = dVar236;
    dStack_f08 = dVar237;
    dStack_ef0 = dVar240;
    dStack_ee8 = dVar241;
  }
  local_1030._8_8_ = dVar114;
  local_1030._0_8_ = dVar108;
  auVar233 = ZEXT1664(auVar111);
  memset(&local_3e0,0,800);
  auVar111 = auVar233._0_16_;
  local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[0]
       = 0.0;
  local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[8]
       = 0.0;
  local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[9]
       = 0.0;
  local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[1]
       = 0.0;
  local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[2]
       = 0.0;
  local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[3]
       = 0.0;
  local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[4]
       = 0.0;
  local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[5]
       = 0.0;
  uVar106 = indices->_numberCorrespondences;
  dVar108 = 0.0;
  local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[6]
       = local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
         array[8];
  local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[7]
       = local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
         array[9];
  if (0 < (int)uVar106) {
    lVar109 = 0;
    dVar108 = 0.0;
    do {
      iVar101 = (int)lVar109;
      iVar107 = iVar101;
      if (indices->_useIndices == true) {
        iVar107 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar109];
      }
      auVar233 = ZEXT1664(auVar233._0_16_);
      (*adapter->_vptr_AbsoluteAdapterBase[5])(local_dc0,adapter,(long)iVar107);
      iVar107 = iVar101;
      if (indices->_useIndices == true) {
        iVar107 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar109];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_700,adapter,(long)iVar107);
      auVar171._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[0] * (double)local_dc0._0_8_;
      auVar171._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[0] * (double)local_dc0._8_8_;
      auVar124._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[1];
      auVar124._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[1];
      auVar111 = vfmadd231pd_fma(auVar171,auVar124,auStack_da8);
      auVar146._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2];
      auVar146._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2];
      auVar111 = vfmadd231pd_fma(auVar111,auVar146,auStack_d90);
      dVar114 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[1] * dStack_d98;
      local_e20._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2] * local_d80;
      iVar107 = iVar101;
      if (indices->_useIndices == true) {
        iVar107 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar109];
      }
      local_1140._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[0] * (double)local_dc0._16_8_;
      (*adapter->_vptr_AbsoluteAdapterBase[4])(&local_980,adapter,(long)iVar107);
      if (indices->_useIndices == true) {
        iVar101 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar109];
      }
      local_1140._8_8_ = 0;
      local_1140._0_8_ = (double)local_e20._0_8_ + dVar114 + (double)local_1140._0_8_;
      (*adapter->_vptr_AbsoluteAdapterBase[6])(adStack_e78 + 1,adapter,(long)iVar101);
      dStack_1108 = adStack_e78[1];
      auVar125._0_8_ = -adStack_e78[1];
      auVar125._8_8_ = 0x8000000000000000;
      local_10f0 = (double)vmovlpd_avx(auVar125);
      auStack_10d8._0_8_ = vmovlpd_avx(auVar125);
      local_10c0 = 0;
      uStack_1048 = 0;
      local_10a0 = 0;
      dStack_1088 = adStack_e78[1] + adStack_e78[1];
      local_1070 = dStack_1088;
      uStack_1058 = 0;
      dStack_10a8 = adStack_e78[3] + adStack_e78[3];
      local_1060 = dStack_10a8;
      auStack_10d8._8_8_ = -adStack_e78[2];
      dStack_10e0 = -adStack_e78[3];
      dStack_10e8 = adStack_e78[2];
      dStack_10c8 = adStack_e78[3];
      local_1040 = dStack_10a8;
      local_1120._8_8_ = adStack_e78[2];
      local_1120._0_8_ = adStack_e78[1];
      dStack_1110 = adStack_e78[3];
      local_1100 = (double)auStack_10d8._8_8_;
      dStack_10f8 = dStack_10e0;
      auVar147._0_8_ = adStack_e78[2] * 2.0;
      auVar147._8_8_ = adStack_e78[3] * -2.0;
      dStack_1078 = (double)vmovlpd_avx(auVar147);
      auStack_10b8 = vshufpd_avx(auVar147,auVar147,1);
      auVar113 = auStack_10b8;
      auStack_1098._8_8_ = adStack_e78[2] * -2.0;
      auStack_1098._0_8_ = adStack_e78[1] * -2.0;
      local_1080 = 0;
      uStack_1068 = 0;
      local_1050 = dStack_1088;
      dStack_1038 = (double)vmovlpd_avx(auVar147);
      dVar217 = auVar111._0_8_;
      local_aa0._0_8_ = dVar217 * dVar217 + -1.0;
      auVar110 = vshufpd_avx(auVar111,auVar111,1);
      dVar114 = auVar110._0_8_;
      local_aa0._8_8_ = dVar217 * dVar114;
      pMStack_a88 = (Matrix<double,_3,_3,_0,_3,_3> *)local_aa0._8_8_;
      dStack_a80 = dVar114 * dVar114 + -1.0;
      auVar116._0_8_ = dVar217 * (double)local_1140._0_8_;
      auVar116._8_8_ = auVar111._8_8_ * (double)local_1140._0_8_;
      local_aa0._16_8_ = vmovlpd_avx(auVar116);
      auVar111 = vshufpd_avx(auVar116,auVar116,1);
      dStack_a78 = (double)vmovhpd_avx(auVar116);
      dStack_a70 = auVar116._0_8_;
      dStack_a68 = auVar116._8_8_;
      dStack_a60 = (double)local_1140._0_8_ * (double)local_1140._0_8_ + -1.0;
      local_dc0._0_8_ = local_aa0;
      local_dc0._16_8_ = local_ea0 + adStack_e78[1];
      auStack_da8._0_8_ = dStack_e98 + adStack_e78[2];
      auStack_da8._8_8_ = adStack_e78[3] + local_f00;
      dStack_d98 = adStack_e78[1] + dStack_ef8;
      auStack_d90._0_8_ = (double)auStack_10d8._8_8_ + dStack_ef0;
      auStack_d90._8_8_ = dStack_10e0 + dStack_ee8;
      auVar81 = _local_dc0;
      local_d80 = local_ed0 + local_10f0;
      auStack_d78._8_8_ = dStack_10e0 + local_f20;
      auStack_d78._0_8_ = dStack_ec8 + adStack_e78[2];
      pdStack_d68 = (double *)((double)auStack_10d8._0_8_ + dStack_f18);
      local_d60 = (double)auStack_10d8._8_8_ + dStack_f10;
      dStack_d58 = adStack_e78[3] + dStack_f08;
      dStack_d50 = local_ec0 + 0.0;
      dStack_d48 = dStack_eb8 + (double)auStack_10b8._0_8_;
      local_d40 = (double)auStack_10b8._8_8_ + local_f40;
      dStack_d38 = dStack_10a8 + dStack_f38;
      dStack_d30 = dStack_f30 + 0.0;
      dStack_d28 = adStack_e78[1] * -2.0 + dStack_f28;
      local_d20 = local_eb0 + adStack_e78[2] * -2.0;
      dStack_d18 = dStack_ea8 + dStack_1088;
      dStack_d10 = local_f60 + 0.0;
      dStack_d08 = dStack_1078 + dStack_f58;
      local_d00 = dStack_1088 + dStack_f50;
      dStack_cf8 = dStack_f48 + 0.0;
      dStack_cf0 = (double)local_1030._0_8_ + dStack_10a8;
      dStack_ce8 = (double)local_1030._8_8_ + 0.0;
      local_ce0 = dStack_1088 + local_f80;
      dStack_cd8 = dStack_f78 + 0.0;
      dStack_cd0 = dStack_10a8 + dStack_f70;
      dStack_cc8 = dStack_1038 + dStack_f68;
      local_cc0 = local_aa0;
      puStack_cb8 = local_dc0 + 0x10;
      dStack_cb0 = 1.48219693752374e-323;
      auVar78._8_8_ = local_aa0._8_8_;
      auVar78._0_8_ = local_aa0._0_8_;
      auVar84._8_8_ = dStack_a80;
      auVar84._0_8_ = local_aa0._8_8_;
      lVar105 = 0x20;
      auVar88._8_8_ = auVar116._8_8_;
      auVar88._0_8_ = auVar116._0_8_;
      do {
        dVar114 = *(double *)(local_dc0 + lVar105);
        auVar209._8_8_ = dVar114;
        auVar209._0_8_ = dVar114;
        auVar11._8_8_ = *(undefined8 *)((long)local_dd0 + lVar105);
        auVar11._0_8_ = *(undefined8 *)((long)local_dd0 + lVar105);
        auVar110 = vmulpd_avx512vl(auVar78,auVar11);
        auVar12._8_8_ = *(undefined8 *)(local_dc0 + lVar105 + -8);
        auVar12._0_8_ = *(undefined8 *)(local_dc0 + lVar105 + -8);
        auVar110 = vfmadd231pd_avx512vl(auVar110,auVar84,auVar12);
        auVar110 = vfmadd231pd_fma(auVar110,auVar88,auVar209);
        *(undefined1 (*) [16])((long)&local_720 + lVar105) = auVar110;
        auVar218._0_8_ = auVar116._0_8_ * *(double *)((long)local_dd0 + lVar105);
        auVar218._8_8_ = auVar116._8_8_ * *(double *)(local_dc0 + lVar105 + -8);
        auVar110 = vshufpd_avx(auVar218,auVar218,1);
        *(double *)
         ((long)local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array + lVar105 + -0x10) =
             auVar218._0_8_ + auVar110._0_8_ + dStack_a60 * dVar114;
        lVar105 = lVar105 + 0x18;
      } while (lVar105 != 0x110);
      local_dc0._16_8_ =
           local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
           .array[0] + local_1160;
      auStack_da8._0_8_ =
           local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
           .array[1] + dStack_1158;
      stack0xfffffffffffff260 = auVar81._32_32_;
      dVar114 = local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                m_data.array[2] + local_1150;
      auVar197._0_8_ = (double)local_dc0._16_8_ * (double)local_aa0._0_8_;
      auVar197._8_8_ = (double)local_dc0._16_8_ * (double)local_aa0._8_8_;
      auVar210._8_8_ = auStack_da8._0_8_;
      auVar210._0_8_ = auStack_da8._0_8_;
      auVar85._8_8_ = dStack_a80;
      auVar85._0_8_ = local_aa0._8_8_;
      auVar110 = vfnmsub231pd_fma(auVar197,auVar210,auVar85);
      auVar219._8_8_ = dVar114;
      auVar219._0_8_ = dVar114;
      auVar89._8_8_ = auVar116._8_8_;
      auVar89._0_8_ = auVar116._0_8_;
      auVar110 = vfnmadd132pd_fma(auVar219,auVar110,auVar89);
      auVar13._8_8_ = 0x8000000000000000;
      auVar13._0_8_ = 0x8000000000000000;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = dStack_a60;
      auVar112 = vxorpd_avx512vl(auVar148,auVar13);
      local_1140._0_8_ =
           (dVar114 * auVar112._0_8_ - auVar111._0_8_ * (double)auStack_da8._0_8_) -
           auVar116._0_8_ * (double)local_dc0._16_8_;
      auStack_10b8 = auVar113;
      local_fe0._0_8_ = &local_700;
      local_fe0._8_8_ = &local_700;
      memset((Matrix<double,_10,_10,_0,_10,_10> *)local_dc0,0,800);
      local_8c0._0_8_ = (XprTypeNested)0x3ff0000000000000;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,3,10,0,3,10>>,Eigen::Matrix<double,3,10,0,3,10>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,10,10,0,10,10>>
                ((Matrix<double,_10,_10,_0,_10,_10> *)local_dc0,
                 (Transpose<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)local_fe0,
                 (Matrix<double,_3,_10,_0,_3,_10> *)&local_700,(Scalar *)local_8c0);
      auVar111 = auVar233._0_16_;
      local_11c0 = auVar110._0_8_;
      dStack_11b8 = auVar110._8_8_;
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[1] = (double)local_dc0._8_8_ +
                 local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[1];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0] = (double)local_dc0._0_8_ +
                 local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[2] = (double)local_dc0._16_8_ +
                 local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[2];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[3] = (double)auStack_da8._0_8_ +
                 local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[3];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[4] = (double)auStack_da8._8_8_ +
                 local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[4];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[5] = dStack_d98 +
                 local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[5];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[6] = (double)auStack_d90._0_8_ +
                 local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[6];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[7] = (double)auStack_d90._8_8_ +
                 local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[7];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[8] = local_d80 +
                 local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[8];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[9] = (double)auStack_d78._0_8_ +
                 local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[9];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[10] = (double)auStack_d78._8_8_ +
                  local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                  m_storage.m_data.array[10];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0xb] = (double)pdStack_d68 +
                   local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                   m_storage.m_data.array[0xb];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0xc] = local_d60 +
                   local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                   m_storage.m_data.array[0xc];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0xd] = dStack_d58 +
                   local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                   m_storage.m_data.array[0xd];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0xe] = dStack_d50 +
                   local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                   m_storage.m_data.array[0xe];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0xf] = dStack_d48 +
                   local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                   m_storage.m_data.array[0xf];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x10] = local_d40 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x10];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x11] = dStack_d38 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x11];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x12] = dStack_d30 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x12];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x13] = dStack_d28 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x13];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x14] = local_d20 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x14];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x15] = dStack_d18 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x15];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x16] = dStack_d10 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x16];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x17] = dStack_d08 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x17];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x18] = local_d00 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x18];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x19] = dStack_cf8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x19];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x1a] = dStack_cf0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x1a];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x1b] = dStack_ce8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x1b];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x1c] = local_ce0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x1c];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x1d] = dStack_cd8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x1d];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x1e] = dStack_cd0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x1e];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x1f] = dStack_cc8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x1f];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x20] = (double)local_cc0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x20];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x21] = (double)puStack_cb8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x21];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x22] = dStack_cb0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x22];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x23] = dStack_ca8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x23];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x24] = local_ca0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x24];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x25] = dStack_c98 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x25];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x26] = dStack_c90 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x26];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x27] = dStack_c88 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x27];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x28] = local_c80 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x28];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x29] = dStack_c78 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x29];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x2a] = dStack_c70 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x2a];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x2b] = dStack_c68 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x2b];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x2c] = local_c60 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x2c];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x2d] = dStack_c58 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x2d];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x2e] = dStack_c50 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x2e];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x2f] = dStack_c48 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x2f];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x30] = local_c40 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x30];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x31] = dStack_c38 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x31];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x32] = dStack_c30 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x32];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x33] = dStack_c28 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x33];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x34] = local_c20 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x34];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x35] = dStack_c18 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x35];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x36] = dStack_c10 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x36];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x37] = dStack_c08 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x37];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x38] = local_c00 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x38];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x39] = dStack_bf8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x39];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x3a] = dStack_bf0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x3a];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x3b] = dStack_be8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x3b];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x3c] = local_be0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x3c];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x3d] = dStack_bd8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x3d];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x3e] = dStack_bd0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x3e];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x3f] = dStack_bc8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x3f];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x40] = local_bc0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x40];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x41] = dStack_bb8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x41];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x42] = dStack_bb0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x42];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x43] = dStack_ba8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x43];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x44] = local_ba0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x44];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x45] = dStack_b98 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x45];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x46] = dStack_b90 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x46];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x47] = dStack_b88 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x47];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x48] = local_b80 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x48];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x49] = dStack_b78 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x49];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x4a] = dStack_b70 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x4a];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x4b] = dStack_b68 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x4b];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x4c] = local_b60 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x4c];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x4d] = dStack_b58 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x4d];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x4e] = dStack_b50 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x4e];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x4f] = dStack_b48 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x4f];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x50] = local_b40 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x50];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x51] = dStack_b38 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x51];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x52] = dStack_b30 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x52];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x53] = dStack_b28 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x53];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x54] = local_b20 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x54];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x55] = dStack_b18 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x55];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x56] = dStack_b10 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x56];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x57] = dStack_b08 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x57];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x58] = local_b00 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x58];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x59] = dStack_af8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x59];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x5a] = dStack_af0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x5a];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x5b] = dStack_ae8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x5b];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x5c] = local_ae0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x5c];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x5d] = dStack_ad8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x5d];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x5e] = dStack_ad0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x5e];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x5f] = dStack_ac8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x5f];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x60] = local_ac0 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x60];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x61] = dStack_ab8 +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x61];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x62] = adStack_ab0[0] +
                    local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x62];
      local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[99] = adStack_ab0[1] +
                  local_3e0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                  m_storage.m_data.array[99];
      pdVar104 = local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array + 2;
      lVar105 = 0;
      do {
        *(double *)(local_dc0 + lVar105 * 8) =
             (double)local_1140._0_8_ * *pdVar104 +
             local_11c0 * ((plain_array<double,_100,_0,_32> *)(pdVar104 + -2))->array[0] +
             dStack_11b8 * pdVar104[-1];
        lVar105 = lVar105 + 1;
        pdVar104 = pdVar104 + 3;
      } while (lVar105 != 10);
      local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[0] = (double)local_dc0._0_8_ +
                 local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[0];
      local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[1] = (double)local_dc0._8_8_ +
                 local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[1];
      local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[2] = (double)local_dc0._16_8_ +
                 local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[2];
      local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[3] = (double)auStack_da8._0_8_ +
                 local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[3];
      local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[4] = (double)auStack_da8._8_8_ +
                 local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[4];
      local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[5] = dStack_d98 +
                 local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[5];
      local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[6] = (double)auStack_d90._0_8_ +
                 local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[6];
      local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[7] = (double)auStack_d90._8_8_ +
                 local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[7];
      local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[8] = local_d80 +
                 local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[8];
      local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[9] = (double)auStack_d78._0_8_ +
                 local_800.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[9];
      dVar108 = dVar108 + (double)local_1140._0_8_ * (double)local_1140._0_8_ +
                          local_11c0 * local_11c0 + dStack_11b8 * dStack_11b8;
      lVar109 = lVar109 + 1;
      uVar106 = indices->_numberCorrespondences;
    } while (lVar109 < (int)uVar106);
  }
  local_e90.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e90.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e90.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar106 < 5) {
    auVar233 = ZEXT1664(auVar111);
    modules::upnp_main(&local_3e0,&local_800,dVar108,&local_e90);
  }
  else {
    auVar233 = ZEXT1664(auVar111);
    modules::upnp_main_sym(&local_3e0,&local_800,dVar108,&local_e90);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e00.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e00.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e00.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_e90.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_e90.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    dVar108 = 0.0;
    do {
      auVar233 = ZEXT1664(auVar233._0_16_);
      math::quaternion2rot
                (&local_e90.
                  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)dVar108].second);
      local_e20._0_8_ = (long)dVar108 * 0x40;
      modules::upnp_fill_s
                (&local_e90.
                  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)dVar108].second,
                 (Matrix<double,_10,_1,_0,_10,_1> *)&local_700);
      auVar81 = _local_dc0;
      local_dc0._8_8_ = local_dc0 + 0x10;
      auVar126._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[0] * local_ea0;
      auVar126._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[0] * dStack_e98;
      auVar149._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[1];
      auVar149._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[1];
      auVar62._8_8_ = dStack_ef0;
      auVar62._0_8_ = dStack_ef8;
      auVar111 = vfmadd231pd_fma(auVar126,auVar149,auVar62);
      auVar172._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2];
      auVar172._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2];
      auVar65._8_8_ = dStack_ec8;
      auVar65._0_8_ = local_ed0;
      auVar111 = vfmadd231pd_fma(auVar111,auVar172,auVar65);
      auVar187._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[3];
      auVar187._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[3];
      auVar58._8_8_ = dStack_f10;
      auVar58._0_8_ = dStack_f18;
      auVar111 = vfmadd231pd_fma(auVar111,auVar187,auVar58);
      auVar198._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[4];
      auVar198._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[4];
      auVar68._8_8_ = dStack_eb8;
      auVar68._0_8_ = local_ec0;
      auVar111 = vfmadd231pd_fma(auVar111,auVar198,auVar68);
      auVar211._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[5];
      auVar211._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[5];
      auVar54._8_8_ = dStack_f30;
      auVar54._0_8_ = dStack_f38;
      auVar111 = vfmadd231pd_fma(auVar111,auVar211,auVar54);
      auVar220._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[6];
      auVar220._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[6];
      auVar71._8_8_ = dStack_ea8;
      auVar71._0_8_ = local_eb0;
      auVar111 = vfmadd231pd_fma(auVar111,auVar220,auVar71);
      auVar224._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[7];
      auVar224._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[7];
      auVar51._8_8_ = dStack_f50;
      auVar51._0_8_ = dStack_f58;
      auVar111 = vfmadd231pd_fma(auVar111,auVar224,auVar51);
      auVar228._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[8];
      auVar228._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[8];
      auVar111 = vfmadd231pd_fma(auVar111,auVar228,local_1030);
      auVar231._8_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[9];
      auVar231._0_8_ =
           local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[9];
      auVar48._8_8_ = dStack_f70;
      auVar48._0_8_ = dStack_f78;
      unique0x001c1680 = vfmadd231pd_fma(auVar111,auVar231,auVar48);
      stack0xfffffffffffff260 = auVar81._32_32_;
      auVar42._8_8_ = dStack_1158;
      auVar42._0_8_ = local_1160;
      auVar111 = vsubpd_avx(unique0x001c1680,auVar42);
      local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[0] = auVar111._0_8_;
      local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[1] = auVar111._8_8_;
      local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[2] = (local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                  m_storage.m_data.array[0] * local_f00 +
                  local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                  m_storage.m_data.array[1] * dStack_ee8 +
                  local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                  m_storage.m_data.array[2] * local_f20 +
                  local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                  m_storage.m_data.array[3] * dStack_f08 +
                  local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                  m_storage.m_data.array[4] * local_f40 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[5] * dStack_f28 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[6] * local_f60 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[7] * dStack_f48 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[8] * local_f80 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[9] * dStack_f68) - local_1150;
      iVar3._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        auVar81._8_8_ = local_aa0._8_8_;
        auVar81._0_8_ = local_aa0._0_8_;
        auVar81._16_8_ = local_aa0._16_8_;
        auVar81._24_8_ = pMStack_a88;
        auVar81._32_8_ = dStack_a80;
        auVar81._40_8_ = dStack_a78;
        auVar81._48_8_ = dStack_a70;
        auVar81._56_8_ = dStack_a68;
        _local_dc0 = vpermpd_avx512f(_DAT_001fcc40,auVar81);
        auVar127._8_8_ = 0;
        auVar127._0_8_ = dStack_a60;
        local_d80 = dStack_a60;
        auVar173._0_8_ =
             local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[0] * (double)local_dc0._0_8_;
        auVar173._8_8_ =
             local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[0] * (double)local_dc0._8_8_;
        auVar188._8_8_ =
             local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[1];
        auVar188._0_8_ =
             local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[1];
        auVar111 = vfnmsub231pd_fma(auVar173,auVar188,auStack_da8);
        auVar199._8_8_ =
             local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[2];
        auVar199._0_8_ =
             local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[2];
        auStack_d78 = vfnmadd132pd_fma(auVar199,auVar111,auStack_d90);
        auVar14._8_8_ = 0x8000000000000000;
        auVar14._0_8_ = 0x8000000000000000;
        auVar111 = vxorpd_avx512vl(auVar127,auVar14);
        pdStack_d68 = (double *)
                      ((local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                        m_storage.m_data.array[2] * auVar111._0_8_ -
                       local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                       m_storage.m_data.array[1] * dStack_a68) -
                      local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                      m_storage.m_data.array[0] * dStack_a70);
        if (iVar3._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          auVar233 = ZEXT1664(auVar233._0_16_);
          std::
          vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>const&>
                    ((vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                      *)__return_storage_ptr__,iVar3,(Matrix<double,_3,_4,_0,_3,_4> *)local_dc0);
        }
        else {
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[4] = (double)auStack_da8._8_8_;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[5] = dStack_d98;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[6] = (double)auStack_d90._0_8_;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[7] = (double)auStack_d90._8_8_;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[8] = dStack_a60;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[9] = (double)auStack_d78._0_8_;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[10] = (double)auStack_d78._8_8_;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[0xb] = (double)pdStack_d68;
          *(undefined1 (*) [64])
           ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
           m_storage.m_data.array = _local_dc0;
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
      sVar103 = indices->_numberCorrespondences;
      if ((int)sVar103 < 1) {
        dVar114 = 0.0;
      }
      else {
        lVar109 = 0;
        iVar107 = 0;
        local_1170 = dVar108;
        do {
          iVar101 = (int)lVar109;
          iVar102 = iVar101;
          if (indices->_useIndices != false) {
            iVar102 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar109];
          }
          auVar233 = ZEXT1664(auVar233._0_16_);
          (*adapter->_vptr_AbsoluteAdapterBase[5])(local_dc0,adapter,(long)iVar102);
          iVar102 = iVar101;
          if (indices->_useIndices != false) {
            iVar102 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar109];
          }
          (*adapter->_vptr_AbsoluteAdapterBase[2])(adStack_e78 + 1,adapter,(long)iVar102);
          iVar102 = iVar101;
          if (indices->_useIndices != false) {
            iVar102 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar109];
          }
          auVar174._0_8_ = adStack_e78[1] * (double)local_dc0._0_8_;
          auVar174._8_8_ = adStack_e78[1] * (double)local_dc0._8_8_;
          auVar128._8_8_ = adStack_e78[2];
          auVar128._0_8_ = adStack_e78[2];
          auVar111 = vfmadd231pd_fma(auVar174,auVar128,auStack_da8);
          auVar150._8_8_ = adStack_e78[3];
          auVar150._0_8_ = adStack_e78[3];
          auVar111 = vfmadd231pd_fma(auVar111,auVar150,auStack_d90);
          dVar108 = adStack_e78[1] * (double)local_dc0._16_8_;
          local_1140._0_8_ = adStack_e78[2] * dStack_d98;
          dVar114 = adStack_e78[3] * local_d80;
          (*adapter->_vptr_AbsoluteAdapterBase[6])(adStack_e78 + 1,adapter,(long)iVar102);
          if (indices->_useIndices != false) {
            iVar101 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar109];
          }
          (*adapter->_vptr_AbsoluteAdapterBase[4])(local_fe0,adapter,(long)iVar101);
          auVar86._8_8_ = dStack_a80;
          auVar86._0_8_ = pMStack_a88;
          auVar151._8_8_ = adStack_e78[3];
          auVar151._0_8_ = adStack_e78[3];
          auVar79._8_8_ = local_aa0._8_8_;
          auVar79._0_8_ = local_aa0._0_8_;
          auVar82._8_8_ = pMStack_a88;
          auVar82._0_8_ = local_aa0._16_8_;
          auVar15._8_8_ = adStack_e78[1];
          auVar15._0_8_ = adStack_e78[1];
          auVar110 = vmulpd_avx512vl(auVar79,auVar15);
          auVar16._8_8_ = adStack_e78[2];
          auVar16._0_8_ = adStack_e78[2];
          auVar110 = vfmadd231pd_avx512vl(auVar110,auVar86,auVar16);
          auVar90._8_8_ = dStack_a68;
          auVar90._0_8_ = dStack_a70;
          auVar113 = vfmadd231pd_fma(auVar110,auVar151,auVar90);
          auVar110 = vmovhpd_avx(auVar82,dStack_a78);
          auVar129._0_8_ = auVar110._0_8_ * adStack_e78[1];
          auVar129._8_8_ = auVar110._8_8_ * adStack_e78[2];
          auVar110 = vshufpd_avx(auVar129,auVar129,1);
          auVar152._0_8_ =
               auVar113._0_8_ +
               local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
               m_data.array[0];
          auVar152._8_8_ =
               auVar113._8_8_ +
               local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
               m_data.array[1];
          auVar44._8_8_ = local_fe0._8_8_;
          auVar44._0_8_ = local_fe0._0_8_;
          auVar113 = vsubpd_avx(auVar152,auVar44);
          local_11a0 = auVar111._0_8_;
          dStack_1198 = auVar111._8_8_;
          iVar107 = iVar107 + (uint)(((auVar129._0_8_ + auVar110._0_8_ + adStack_e78[3] * dStack_a60
                                      + local_980.
                                        super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>
                                        .m_storage.m_data.array[2]) - (double)local_fe0._16_8_) *
                                     (dVar114 + (double)local_1140._0_8_ + dVar108) +
                                     auVar113._0_8_ * (double)local_11a0 +
                                     auVar113._8_8_ * dStack_1198 < 0.0);
          lVar109 = lVar109 + 1;
          sVar103 = indices->_numberCorrespondences;
        } while (lVar109 < (int)sVar103);
        dVar114 = (double)iVar107;
        dVar108 = local_1170;
      }
      auVar111 = vcvtusi2sd_avx512f(auVar233._0_16_,sVar103);
      auVar111 = vfmadd132sd_fma(auVar111,ZEXT816(0x3fe0000000000000),ZEXT816(0x3fc999999999999a));
      auVar111 = vroundsd_avx(auVar111,auVar111,9);
      if (dVar114 < auVar111._0_8_) {
        auVar233 = ZEXT1664(auVar233._0_16_);
        std::
        vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
        ::push_back(&local_e00,
                    (value_type *)
                    ((long)&((pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                            (&(local_e90.
                               super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->second + -1))->first +
                    local_e20._0_8_));
      }
      dVar108 = (double)((long)dVar108 + 1);
    } while ((ulong)dVar108 <
             (ulong)((long)local_e90.
                           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_e90.
                           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  if (local_e00.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_e00.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pMVar4 = (__return_storage_ptr__->
             super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pMVar4) {
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pMVar4;
    }
    if (local_e00.
        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_e00.
        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar106 = 0;
      do {
        local_8c8 = uVar106;
        math::quaternion2rot
                  (&local_e00.
                    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar106].second);
        if ((int)indices->_numberCorrespondences < 1) {
          local_11a0 = (undefined1  [8])0x0;
          dStack_1198 = 0.0;
          local_11c0 = 0.0;
          dStack_11b8 = 0.0;
          local_1140 = ZEXT816(0);
          local_11b0 = 0.0;
          dStack_11a8 = 0.0;
          local_e20._0_16_ = ZEXT816(0);
          local_1170 = 0.0;
          dStack_1168 = 0.0;
          local_ff0 = 0.0;
          dStack_fe8 = 0.0;
          local_1000 = 0.0;
          dStack_ff8 = 0.0;
          local_1010 = 0.0;
          dStack_1008 = 0.0;
          local_1020 = ZEXT816(0);
          local_dd0[0] = 0.0;
          local_dd0[1] = 0.0;
          local_de0 = 0.0;
          dStack_dd8 = 0.0;
          local_990 = 0.0;
          dStack_988 = 0.0;
          local_9a0 = 0.0;
          dStack_998 = 0.0;
          local_9b0 = 0.0;
          dStack_9a8 = 0.0;
        }
        else {
          local_11a0 = (undefined1  [8])0x0;
          dStack_1198 = 0.0;
          lVar109 = 0;
          local_11c0 = 0.0;
          dStack_11b8 = 0.0;
          local_1140 = ZEXT816(0);
          local_11b0 = 0.0;
          dStack_11a8 = 0.0;
          local_e20._0_16_ = ZEXT816(0);
          local_1170 = 0.0;
          dStack_1168 = 0.0;
          local_ff0 = 0.0;
          dStack_fe8 = 0.0;
          local_1000 = 0.0;
          dStack_ff8 = 0.0;
          local_1010 = 0.0;
          dStack_1008 = 0.0;
          local_1020 = ZEXT816(0);
          local_dd0[0] = 0.0;
          local_dd0[1] = 0.0;
          local_de0 = 0.0;
          dStack_dd8 = 0.0;
          local_990 = 0.0;
          dStack_988 = 0.0;
          local_9a0 = 0.0;
          dStack_998 = 0.0;
          local_9b0 = 0.0;
          dStack_9a8 = 0.0;
          do {
            iVar101 = (int)lVar109;
            iVar107 = iVar101;
            if (indices->_useIndices == true) {
              iVar107 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar109];
            }
            (*adapter->_vptr_AbsoluteAdapterBase[5])(local_dc0,adapter,(long)iVar107);
            iVar107 = iVar101;
            if (indices->_useIndices == true) {
              iVar107 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar109];
            }
            (*adapter->_vptr_AbsoluteAdapterBase[2])
                      ((Matrix<double,_3,_10,_0,_3,_10> *)local_aa0,adapter,(long)iVar107);
            dVar114 = local_810;
            auVar113 = local_850._48_16_;
            auVar110 = local_850._0_16_;
            auVar130._0_8_ = (double)local_aa0._0_8_ * (double)local_dc0._0_8_;
            auVar130._8_8_ = (double)local_aa0._0_8_ * (double)local_dc0._8_8_;
            auVar153._8_8_ = local_aa0._8_8_;
            auVar153._0_8_ = local_aa0._8_8_;
            auVar111 = vfmadd231pd_fma(auVar130,auVar153,auStack_da8);
            auVar175._8_8_ = local_aa0._16_8_;
            auVar175._0_8_ = local_aa0._16_8_;
            auVar111 = vfmadd231pd_fma(auVar111,auVar175,auStack_d90);
            dVar108 = (double)local_aa0._0_8_ * (double)local_dc0._16_8_ +
                      (double)local_aa0._8_8_ * dStack_d98 + (double)local_aa0._16_8_ * local_d80;
            dVar217 = auVar111._0_8_;
            local_dc0._8_8_ = dVar217 * dVar217 + -1.0;
            local_dc0._0_8_ = local_850;
            auVar111 = vshufpd_avx(auVar111,auVar111,1);
            dVar222 = auVar111._0_8_;
            local_dc0._16_8_ = dVar217 * dVar222;
            auStack_da8._0_8_ = dVar108 * dVar217;
            auStack_da8._8_8_ = dVar217 * dVar222;
            dStack_d98 = dVar222 * dVar222 + -1.0;
            auStack_d90._0_8_ = dVar108 * dVar222;
            auStack_d90._8_8_ = dVar108 * dVar217;
            local_d80 = dVar108 * dVar222;
            auStack_d78._8_8_ = local_850;
            auStack_d78._0_8_ = dVar108 * dVar108 + -1.0;
            pdStack_d68 = (double *)(local_dc0 + 8);
            local_d60 = 1.48219693752374e-323;
            auVar93._8_8_ = local_850._24_8_;
            auVar93._0_8_ = local_850._16_8_;
            auVar95._8_8_ = local_850._32_8_;
            auVar95._0_8_ = local_850._24_8_;
            auVar111 = vmovhpd_avx(auVar93,local_850._40_8_);
            lVar105 = 0x18;
            do {
              dVar108 = *(double *)(local_dc0 + lVar105);
              auVar200._8_8_ = dVar108;
              auVar200._0_8_ = dVar108;
              auVar17._8_8_ = *(undefined8 *)((long)local_dd0 + lVar105);
              auVar17._0_8_ = *(undefined8 *)((long)local_dd0 + lVar105);
              auVar112 = vmulpd_avx512vl(auVar110,auVar17);
              auVar18._8_8_ = *(undefined8 *)(local_dc0 + lVar105 + -8);
              auVar18._0_8_ = *(undefined8 *)(local_dc0 + lVar105 + -8);
              auVar112 = vfmadd231pd_avx512vl(auVar112,auVar95,auVar18);
              auVar112 = vfmadd231pd_fma(auVar112,auVar113,auVar200);
              *(undefined1 (*) [16])((long)&dStack_ab8 + lVar105) = auVar112;
              auVar212._0_8_ = auVar111._0_8_ * *(double *)((long)local_dd0 + lVar105);
              auVar212._8_8_ = auVar111._8_8_ * *(double *)(local_dc0 + lVar105 + -8);
              auVar112 = vshufpd_avx(auVar212,auVar212,1);
              *(double *)((long)adStack_ab0 + lVar105 + 8) =
                   auVar212._0_8_ + auVar112._0_8_ + dVar108 * dVar114;
              lVar105 = lVar105 + 0x18;
            } while (lVar105 != 0x60);
            if (indices->_useIndices == true) {
              iVar101 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar109];
            }
            (*adapter->_vptr_AbsoluteAdapterBase[6])(local_dc0,adapter,(long)iVar101);
            dVar108 = dStack_a60;
            auVar131._0_8_ = (double)local_dc0._0_8_ * adStack_e78[1];
            auVar131._8_8_ = (double)local_dc0._0_8_ * adStack_e78[2];
            auVar154._8_8_ = local_dc0._8_8_;
            auVar154._0_8_ = local_dc0._8_8_;
            auVar111 = vfmadd231pd_fma(auVar131,auVar154,auStack_e58);
            auVar176._8_8_ = local_dc0._16_8_;
            auVar176._0_8_ = local_dc0._16_8_;
            auVar76._8_8_ = dStack_e38;
            auVar76._0_8_ = dStack_e40;
            local_1120 = vfmadd231pd_fma(auVar111,auVar176,auVar76);
            dStack_1110 = (double)local_dc0._0_8_ * adStack_e78[3] +
                          (double)local_dc0._8_8_ * dStack_e48 +
                          (double)local_dc0._16_8_ * local_e30;
            dStack_1108 = (double)vmovlpd_avx(local_1120);
            local_10c0 = 0;
            dStack_10a8 = dStack_1110 + dStack_1110;
            auVar111 = vshufpd_avx(local_1120,local_1120,1);
            dStack_1078 = auVar111._0_8_ + auVar111._0_8_;
            local_1060 = dStack_10a8;
            uStack_1048 = 0;
            dStack_10e8 = (double)vmovhpd_avx(local_1120);
            dStack_1088 = local_1120._0_8_;
            auStack_10d8._0_8_ = -dStack_1088;
            auStack_10d8._8_8_ = local_1120._8_8_ ^ 0x8000000000000000;
            local_10f0 = (double)vmovlpd_avx(auStack_10d8);
            auVar111 = vshufps_avx(auStack_10d8,auStack_10d8,0x4e);
            local_1100 = (double)vmovlpd_avx(auVar111);
            local_10a0 = 0;
            dStack_1088 = dStack_1088 + dStack_1088;
            local_1070 = dStack_1088;
            uStack_1058 = 0;
            local_1040 = dStack_10a8;
            auVar155._0_8_ = -dStack_1110;
            auVar155._8_8_ = 0x8000000000000000;
            dStack_10f8 = (double)vmovlpd_avx(auVar155);
            dStack_10e0 = (double)vmovlpd_avx(auVar155);
            dStack_10c8 = dStack_1110;
            auStack_10b8._8_8_ = dStack_1078;
            auStack_10b8._0_8_ = dStack_1110 * -2.0;
            auVar19._8_8_ = 0xc000000000000000;
            auVar19._0_8_ = 0xc000000000000000;
            auStack_1098 = vmulpd_avx512vl(local_1120,auVar19);
            local_1080 = 0;
            uStack_1068 = 0;
            local_1050 = dStack_1088;
            dStack_1038 = dStack_1078;
            auVar80._8_8_ = local_aa0._8_8_;
            auVar80._0_8_ = local_aa0._0_8_;
            auVar83._8_8_ = pMStack_a88;
            auVar83._0_8_ = local_aa0._16_8_;
            auVar87._8_8_ = dStack_a80;
            auVar87._0_8_ = pMStack_a88;
            auVar91._8_8_ = dStack_a68;
            auVar91._0_8_ = dStack_a70;
            auVar111 = vmovhpd_avx(auVar83,dStack_a78);
            lVar105 = 0x10;
            do {
              dVar114 = *(double *)(local_1120 + lVar105);
              auVar201._8_8_ = dVar114;
              auVar201._0_8_ = dVar114;
              auVar20._8_8_ = *(undefined8 *)(local_1140 + lVar105 + 0x10);
              auVar20._0_8_ = *(undefined8 *)(local_1140 + lVar105 + 0x10);
              auVar110 = vmulpd_avx512vl(auVar80,auVar20);
              auVar21._8_8_ = *(undefined8 *)(local_1140 + lVar105 + 0x18);
              auVar21._0_8_ = *(undefined8 *)(local_1140 + lVar105 + 0x18);
              auVar110 = vfmadd231pd_avx512vl(auVar110,auVar87,auVar21);
              auVar110 = vfmadd231pd_fma(auVar110,auVar91,auVar201);
              *(undefined1 (*) [16])((long)local_dd0 + lVar105) = auVar110;
              auVar213._0_8_ = auVar111._0_8_ * *(double *)(local_1140 + lVar105 + 0x10);
              auVar213._8_8_ = auVar111._8_8_ * *(double *)(local_1140 + lVar105 + 0x18);
              auVar110 = vshufpd_avx(auVar213,auVar213,1);
              *(double *)(local_dc0 + lVar105) = auVar213._0_8_ + auVar110._0_8_ + dVar108 * dVar114
              ;
              lVar105 = lVar105 + 0x18;
            } while (lVar105 != 0x100);
            local_9b0 = local_9b0 + (double)local_dc0._0_8_;
            dStack_9a8 = dStack_9a8 + (double)local_dc0._8_8_;
            local_9a0 = local_9a0 + (double)local_dc0._16_8_;
            dStack_998 = dStack_998 + (double)auStack_da8._0_8_;
            local_990 = local_990 + (double)auStack_da8._8_8_;
            dStack_988 = dStack_988 + dStack_d98;
            local_de0 = local_de0 + (double)auStack_d90._0_8_;
            dStack_dd8 = dStack_dd8 + (double)auStack_d90._8_8_;
            local_dd0[0] = local_dd0[0] + local_d80;
            local_dd0[1] = local_dd0[1] + (double)auStack_d78._0_8_;
            local_1020._8_8_ = (double)local_1020._8_8_ + (double)pdStack_d68;
            local_1020._0_8_ = (double)local_1020._0_8_ + (double)auStack_d78._8_8_;
            local_1010 = local_1010 + local_d60;
            dStack_1008 = dStack_1008 + dStack_d58;
            local_1000 = local_1000 + dStack_d50;
            dStack_ff8 = dStack_ff8 + dStack_d48;
            local_ff0 = local_ff0 + local_d40;
            dStack_fe8 = dStack_fe8 + dStack_d38;
            local_1170 = local_1170 + dStack_d30;
            dStack_1168 = dStack_1168 + dStack_d28;
            local_e20._8_8_ = (double)local_e20._8_8_ + dStack_d18;
            local_e20._0_8_ = (double)local_e20._0_8_ + local_d20;
            local_11b0 = local_11b0 + dStack_d10;
            dStack_11a8 = dStack_11a8 + dStack_d08;
            local_1140._8_8_ = (double)local_1140._8_8_ + dStack_cf8;
            local_1140._0_8_ = (double)local_1140._0_8_ + local_d00;
            local_11c0 = local_11c0 + dStack_cf0;
            dStack_11b8 = dStack_11b8 + dStack_ce8;
            local_11a0 = (undefined1  [8])((double)local_11a0 + local_ce0);
            dStack_1198 = dStack_1198 + dStack_cd8;
            lVar109 = lVar109 + 1;
          } while (lVar109 < (int)indices->_numberCorrespondences);
        }
        memset(&local_700,0,800);
        local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
        array[0] = 0.0;
        local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
        array[1] = 0.0;
        local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
        array[4] = 0.0;
        local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
        array[5] = 0.0;
        local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
        array[6] = 0.0;
        local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
        array[7] = 0.0;
        local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
        array[8] = 0.0;
        local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
        array[9] = 0.0;
        local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
        array[2] = local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                   m_storage.m_data.array[0];
        local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
        array[3] = local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                   m_storage.m_data.array[1];
        if (0 < (int)indices->_numberCorrespondences) {
          lVar109 = 0;
          do {
            iVar101 = (int)lVar109;
            iVar107 = iVar101;
            if (indices->_useIndices == true) {
              iVar107 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar109];
            }
            (*adapter->_vptr_AbsoluteAdapterBase[5])(local_dc0,adapter,(long)iVar107);
            iVar107 = iVar101;
            if (indices->_useIndices == true) {
              iVar107 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar109];
            }
            (*adapter->_vptr_AbsoluteAdapterBase[2])
                      ((Matrix<double,_3,_10,_0,_3,_10> *)local_aa0,adapter,(long)iVar107);
            iVar107 = iVar101;
            if (indices->_useIndices == true) {
              iVar107 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar109];
            }
            auVar177._0_8_ = (double)local_aa0._0_8_ * (double)local_dc0._0_8_;
            auVar177._8_8_ = (double)local_aa0._0_8_ * (double)local_dc0._8_8_;
            auVar132._8_8_ = local_aa0._8_8_;
            auVar132._0_8_ = local_aa0._8_8_;
            auVar111 = vfmadd231pd_fma(auVar177,auVar132,auStack_da8);
            auVar156._8_8_ = local_aa0._16_8_;
            auVar156._0_8_ = local_aa0._16_8_;
            local_8e0 = vfmadd231pd_fma(auVar111,auVar156,auStack_d90);
            local_8f0._0_8_ = (double)local_aa0._0_8_ * (double)local_dc0._16_8_;
            local_900._0_8_ = (double)local_aa0._8_8_ * dStack_d98;
            local_910 = (double)local_aa0._16_8_ * local_d80;
            (*adapter->_vptr_AbsoluteAdapterBase[4])(local_8c0,adapter,(long)iVar107);
            if (indices->_useIndices == true) {
              iVar101 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar109];
            }
            (*adapter->_vptr_AbsoluteAdapterBase[6])(local_dc0,adapter,(long)iVar101);
            dVar108 = local_910 + (double)local_900._0_8_ + (double)local_8f0._0_8_;
            auVar157._0_8_ = (double)local_dc0._0_8_ * adStack_e78[1];
            auVar157._8_8_ = (double)local_dc0._0_8_ * adStack_e78[2];
            auVar178._8_8_ = local_dc0._8_8_;
            auVar178._0_8_ = local_dc0._8_8_;
            auVar111 = vfmadd231pd_fma(auVar157,auVar178,auStack_e58);
            auVar189._8_8_ = local_dc0._16_8_;
            auVar189._0_8_ = local_dc0._16_8_;
            auVar77._8_8_ = dStack_e38;
            auVar77._0_8_ = dStack_e40;
            local_1120 = vfmadd231pd_fma(auVar111,auVar189,auVar77);
            dStack_1110 = (double)local_dc0._0_8_ * adStack_e78[3] +
                          (double)local_dc0._8_8_ * dStack_e48 +
                          (double)local_dc0._16_8_ * local_e30;
            dStack_1108 = (double)vmovlpd_avx(local_1120);
            local_10c0 = 0;
            dStack_10a8 = dStack_1110 + dStack_1110;
            auVar111 = vshufpd_avx(local_1120,local_1120,1);
            dStack_1078 = auVar111._0_8_ + auVar111._0_8_;
            local_1060 = dStack_10a8;
            uStack_1048 = 0;
            dStack_10e8 = (double)vmovhpd_avx(local_1120);
            dVar217 = local_1120._0_8_;
            auStack_10d8._0_8_ = -dVar217;
            auStack_10d8._8_8_ = -local_1120._8_8_;
            local_10f0 = (double)vmovlpd_avx(auStack_10d8);
            auVar111 = vshufps_avx(auStack_10d8,auStack_10d8,0x4e);
            local_1100 = (double)vmovlpd_avx(auVar111);
            local_10a0 = 0;
            dStack_1088 = dVar217 + dVar217;
            local_1070 = dStack_1088;
            uStack_1058 = 0;
            local_1040 = dStack_10a8;
            auVar179._0_8_ = -dStack_1110;
            auVar179._8_8_ = 0x8000000000000000;
            dStack_10f8 = (double)vmovlpd_avx(auVar179);
            dStack_10e0 = (double)vmovlpd_avx(auVar179);
            dStack_10c8 = dStack_1110;
            auStack_10b8._8_8_ = dStack_1078;
            auStack_10b8._0_8_ = dStack_1110 * -2.0;
            auVar22._8_8_ = 0xc000000000000000;
            auVar22._0_8_ = 0xc000000000000000;
            auStack_1098 = vmulpd_avx512vl(local_1120,auVar22);
            auVar110 = auStack_1098;
            local_1080 = 0;
            uStack_1068 = 0;
            local_1050 = dStack_1088;
            dStack_1038 = dStack_1078;
            dVar222 = local_8e0._0_8_;
            local_fe0._0_8_ = dVar222 * dVar222 + -1.0;
            auVar111 = vshufpd_avx(local_8e0,local_8e0,1);
            dVar114 = auVar111._0_8_;
            local_fe0._8_8_ = dVar222 * dVar114;
            local_fe0._24_8_ = local_fe0._8_8_;
            local_fe0._32_8_ = dVar114 * dVar114 + -1.0;
            local_8f0._0_8_ = dVar222 * dVar108;
            local_8f0._8_8_ = local_8e0._8_8_ * dVar108;
            local_fe0._16_8_ = vmovlpd_avx(local_8f0);
            local_900 = vshufpd_avx(local_8f0,local_8f0,1);
            local_fe0._40_8_ = vmovhpd_avx(local_8f0);
            stack0xfffffffffffff050 = local_8f0;
            local_910 = dVar108 * dVar108 + -1.0;
            local_fa0 = local_910;
            local_dc0._0_8_ = local_fe0;
            local_dc0._16_8_ = local_9b0 + dVar217;
            auStack_da8._0_8_ = dStack_9a8 + local_1120._8_8_;
            auStack_da8._8_8_ = local_9a0 + dStack_1110;
            dStack_d98 = dStack_998 + dStack_1108;
            auStack_d90._0_8_ = local_990 + local_1100;
            auStack_d90._8_8_ = dStack_988 + dStack_10f8;
            auVar233 = _local_dc0;
            local_d80 = local_de0 + local_10f0;
            auStack_d78._8_8_ = local_dd0[0] + dStack_10e0;
            auStack_d78._0_8_ = dStack_dd8 + dStack_10e8;
            pdStack_d68 = (double *)(local_dd0[1] + (double)auStack_10d8._0_8_);
            local_d60 = (double)local_1020._0_8_ + (double)auStack_10d8._8_8_;
            dStack_d58 = (double)local_1020._8_8_ + dStack_1110;
            dStack_d50 = local_1010 + 0.0;
            dStack_d48 = dStack_1008 + dStack_1110 * -2.0;
            local_d40 = local_1000 + dStack_1078;
            dStack_d38 = dStack_ff8 + dStack_10a8;
            dStack_d30 = local_ff0 + 0.0;
            dStack_d28 = dStack_fe8 + (double)auStack_1098._0_8_;
            local_d20 = local_1170 + (double)auStack_1098._8_8_;
            dStack_d18 = dStack_1168 + dStack_1088;
            dStack_d10 = (double)local_e20._0_8_ + 0.0;
            dStack_d08 = (double)local_e20._8_8_ + dStack_1078;
            local_d00 = local_11b0 + dStack_1088;
            dStack_cf8 = dStack_11a8 + 0.0;
            dStack_cf0 = (double)local_1140._0_8_ + dStack_10a8;
            dStack_ce8 = (double)local_1140._8_8_ + 0.0;
            local_ce0 = local_11c0 + dStack_1088;
            dStack_cd8 = dStack_11b8 + 0.0;
            dStack_cd0 = (double)local_11a0 + dStack_10a8;
            dStack_cc8 = dStack_1198 + dStack_1078;
            local_cc0 = local_fe0;
            puStack_cb8 = local_dc0 + 0x10;
            dStack_cb0 = 1.48219693752374e-323;
            auVar45._8_8_ = local_fe0._8_8_;
            auVar45._0_8_ = local_fe0._0_8_;
            auVar46._8_8_ = local_fe0._32_8_;
            auVar46._0_8_ = local_fe0._8_8_;
            lVar105 = 0x20;
            do {
              dVar108 = *(double *)(local_dc0 + lVar105);
              auVar180._8_8_ = dVar108;
              auVar180._0_8_ = dVar108;
              auVar23._8_8_ = *(undefined8 *)((long)local_dd0 + lVar105);
              auVar23._0_8_ = *(undefined8 *)((long)local_dd0 + lVar105);
              auVar111 = vmulpd_avx512vl(auVar45,auVar23);
              auVar24._8_8_ = *(undefined8 *)(local_dc0 + lVar105 + -8);
              auVar24._0_8_ = *(undefined8 *)(local_dc0 + lVar105 + -8);
              auVar111 = vfmadd231pd_avx512vl(auVar111,auVar46,auVar24);
              auVar111 = vfmadd231pd_fma(auVar111,local_8f0,auVar180);
              *(undefined1 (*) [16])((long)&local_ac0 + lVar105) = auVar111;
              auVar190._0_8_ = (double)local_8f0._0_8_ * *(double *)((long)local_dd0 + lVar105);
              auVar190._8_8_ = (double)local_8f0._8_8_ * *(double *)(local_dc0 + lVar105 + -8);
              auVar111 = vshufpd_avx(auVar190,auVar190,1);
              *(double *)((long)adStack_ab0 + lVar105) =
                   auVar190._0_8_ + auVar111._0_8_ + local_910 * dVar108;
              lVar105 = lVar105 + 0x18;
            } while (lVar105 != 0x110);
            uStack_908 = 0;
            local_740 = (double)local_8c0._0_8_ + local_1160;
            auStack_da8._0_8_ = (double)local_8c0._8_8_ + dStack_1158;
            local_dc0._16_8_ = local_740;
            stack0xfffffffffffff260 = auVar233._32_32_;
            local_750 = (double)local_8c0._16_8_ + local_1150;
            auVar117._0_8_ = local_740 * (double)local_fe0._0_8_;
            auVar117._8_8_ = local_740 * (double)local_fe0._8_8_;
            local_760._8_8_ = auStack_da8._0_8_;
            local_760._0_8_ = auStack_da8._0_8_;
            auVar47._8_8_ = local_fe0._32_8_;
            auVar47._0_8_ = local_fe0._8_8_;
            auVar111 = vfnmsub231pd_fma(auVar117,local_760,auVar47);
            uStack_748 = 0;
            auVar133._8_8_ = local_750;
            auVar133._0_8_ = local_750;
            local_8e0 = vfnmadd132pd_fma(auVar133,auVar111,local_8f0);
            auStack_1098 = auVar110;
            local_780.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[0] = (double)local_aa0;
            local_780.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[1] = (double)local_aa0;
            dStack_738 = local_740;
            memset((Matrix<double,_10,_10,_0,_10,_10> *)local_dc0,0,800);
            local_870._0_8_ = 0x3ff0000000000000;
            Eigen::internal::
            generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,3,10,0,3,10>>,Eigen::Matrix<double,3,10,0,3,10>,Eigen::DenseShape,Eigen::DenseShape,8>
            ::scaleAndAddTo<Eigen::Matrix<double,10,10,0,10,10>>
                      ((Matrix<double,_10,_10,_0,_10,_10> *)local_dc0,
                       (Transpose<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)&local_780,
                       (Matrix<double,_3,_10,_0,_3,_10> *)local_aa0,(Scalar *)local_870);
            auVar92._8_8_ = uStack_908;
            auVar92._0_8_ = local_910;
            auVar25._8_8_ = 0x8000000000000000;
            auVar25._0_8_ = 0x8000000000000000;
            auVar111 = vxorpd_avx512vl(auVar92,auVar25);
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0] =
                 (double)local_dc0._0_8_ +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[1] =
                 (double)local_dc0._8_8_ +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[1];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[2] =
                 (double)local_dc0._16_8_ +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[2];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[3] =
                 (double)auStack_da8._0_8_ +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[3];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[4] =
                 (double)auStack_da8._8_8_ +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[4];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[5] =
                 dStack_d98 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[5];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[6] =
                 (double)auStack_d90._0_8_ +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[6];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[7] =
                 (double)auStack_d90._8_8_ +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[7];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[8] =
                 local_d80 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[8];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[9] =
                 (double)auStack_d78._0_8_ +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[9];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[10] =
                 (double)auStack_d78._8_8_ +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[10];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0xb] =
                 (double)pdStack_d68 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0xb];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0xc] =
                 local_d60 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0xc];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0xd] =
                 dStack_d58 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0xd];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0xe] =
                 dStack_d50 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0xe];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0xf] =
                 dStack_d48 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0xf];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x10] =
                 local_d40 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x10];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x11] =
                 dStack_d38 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x11];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x12] =
                 dStack_d30 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x12];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x13] =
                 dStack_d28 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x13];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x14] =
                 local_d20 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x14];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x15] =
                 dStack_d18 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x15];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x16] =
                 dStack_d10 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x16];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x17] =
                 dStack_d08 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x17];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x18] =
                 local_d00 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x18];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x19] =
                 dStack_cf8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x19];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x1a] =
                 dStack_cf0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x1a];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x1b] =
                 dStack_ce8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x1b];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x1c] =
                 local_ce0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x1c];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x1d] =
                 dStack_cd8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x1d];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x1e] =
                 dStack_cd0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x1e];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x1f] =
                 dStack_cc8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x1f];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x20] =
                 (double)local_cc0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x20];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x21] =
                 (double)puStack_cb8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x21];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x22] =
                 dStack_cb0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x22];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x23] =
                 dStack_ca8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x23];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x24] =
                 local_ca0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x24];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x25] =
                 dStack_c98 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x25];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x26] =
                 dStack_c90 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x26];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x27] =
                 dStack_c88 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x27];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x28] =
                 local_c80 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x28];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x29] =
                 dStack_c78 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x29];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x2a] =
                 dStack_c70 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x2a];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x2b] =
                 dStack_c68 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x2b];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x2c] =
                 local_c60 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x2c];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x2d] =
                 dStack_c58 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x2d];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x2e] =
                 dStack_c50 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x2e];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x2f] =
                 dStack_c48 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x2f];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x30] =
                 local_c40 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x30];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x31] =
                 dStack_c38 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x31];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x32] =
                 dStack_c30 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x32];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x33] =
                 dStack_c28 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x33];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x34] =
                 local_c20 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x34];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x35] =
                 dStack_c18 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x35];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x36] =
                 dStack_c10 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x36];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x37] =
                 dStack_c08 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x37];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x38] =
                 local_c00 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x38];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x39] =
                 dStack_bf8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x39];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x3a] =
                 dStack_bf0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x3a];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x3b] =
                 dStack_be8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x3b];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x3c] =
                 local_be0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x3c];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x3d] =
                 dStack_bd8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x3d];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x3e] =
                 dStack_bd0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x3e];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x3f] =
                 dStack_bc8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x3f];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x40] =
                 local_bc0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x40];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x41] =
                 dStack_bb8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x41];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x42] =
                 dStack_bb0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x42];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x43] =
                 dStack_ba8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x43];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x44] =
                 local_ba0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x44];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x45] =
                 dStack_b98 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x45];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x46] =
                 dStack_b90 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x46];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x47] =
                 dStack_b88 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x47];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x48] =
                 local_b80 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x48];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x49] =
                 dStack_b78 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x49];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x4a] =
                 dStack_b70 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x4a];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x4b] =
                 dStack_b68 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x4b];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x4c] =
                 local_b60 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x4c];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x4d] =
                 dStack_b58 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x4d];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x4e] =
                 dStack_b50 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x4e];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x4f] =
                 dStack_b48 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x4f];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x50] =
                 local_b40 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x50];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x51] =
                 dStack_b38 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x51];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x52] =
                 dStack_b30 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x52];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x53] =
                 dStack_b28 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x53];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x54] =
                 local_b20 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x54];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x55] =
                 dStack_b18 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x55];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x56] =
                 dStack_b10 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x56];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x57] =
                 dStack_b08 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x57];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x58] =
                 local_b00 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x58];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x59] =
                 dStack_af8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x59];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x5a] =
                 dStack_af0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x5a];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x5b] =
                 dStack_ae8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x5b];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x5c] =
                 local_ae0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x5c];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x5d] =
                 dStack_ad8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x5d];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x5e] =
                 dStack_ad0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x5e];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x5f] =
                 dStack_ac8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x5f];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x60] =
                 local_ac0 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x60];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x61] =
                 dStack_ab8 +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x61];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[0x62] =
                 adStack_ab0[0] +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0x62];
            local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
            m_data.array[99] =
                 adStack_ab0[1] +
                 local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[99];
            pdVar104 = (double *)(local_aa0 + 0x10);
            lVar105 = 0;
            do {
              *(double *)(local_dc0 + lVar105 * 8) =
                   ((auVar111._0_8_ * local_750 - (double)local_760._0_8_ * (double)local_900._0_8_)
                   - local_740 * (double)local_8f0._0_8_) * *pdVar104 +
                   (double)local_8e0._0_8_ * pdVar104[-2] + (double)local_8e0._8_8_ * pdVar104[-1];
              lVar105 = lVar105 + 1;
              pdVar104 = pdVar104 + 3;
            } while (lVar105 != 10);
            local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[0] =
                 (double)local_dc0._0_8_ +
                 local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[0];
            local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[1] =
                 (double)local_dc0._8_8_ +
                 local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[1];
            local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[2] =
                 (double)local_dc0._16_8_ +
                 local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[2];
            local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[3] =
                 (double)auStack_da8._0_8_ +
                 local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[3];
            local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[4] =
                 (double)auStack_da8._8_8_ +
                 local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[4];
            local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[5] =
                 dStack_d98 +
                 local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[5];
            local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[6] =
                 (double)auStack_d90._0_8_ +
                 local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[6];
            local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[7] =
                 (double)auStack_d90._8_8_ +
                 local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[7];
            local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[8] =
                 local_d80 +
                 local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[8];
            local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[9] =
                 (double)auStack_d78._0_8_ +
                 local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[9];
            lVar109 = lVar109 + 1;
          } while (lVar109 < (int)indices->_numberCorrespondences);
        }
        auVar96._8_8_ =
             local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
             m_data.array[0x29];
        auVar96._0_8_ =
             local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
             m_data.array[0x28];
        auVar134._0_8_ =
             local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[4] +
             local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[4];
        auVar134._8_8_ =
             local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[5] +
             local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[5];
        auVar111 = vmovhpd_avx(auVar96,local_700.
                                       super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>
                                       .m_storage.m_data.array[0x32]);
        auVar26._8_8_ = 0x4000000000000000;
        auVar26._0_8_ = 0x4000000000000000;
        local_870 = vfmadd132pd_avx512vl(auVar111,auVar134,auVar26);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_700.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                       m_storage.m_data.array[0x3c];
        auVar118._8_8_ = 0;
        auVar118._0_8_ =
             local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[6] +
             local_980.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
             m_data.array[6];
        auVar111 = vfmadd231sd_fma(auVar118,ZEXT816(0x4000000000000000),auVar2);
        local_860 = auVar111._0_8_;
        Jac(&local_700,&local_980,local_860,(Matrix3d *)local_fe0);
        local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (double *)0x0;
        local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (double *)0x0;
        local_dc0._0_8_ = (XprTypeNested)0xbff0000000000000;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_1190,(iterator)0x0,(double *)local_dc0);
        local_dc0._0_8_ = local_fa0 + (double)local_fe0._32_8_ + (double)local_fe0._0_8_;
        if (local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_1190,
                     (iterator)
                     local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)local_dc0);
        }
        else {
          *local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)local_dc0._0_8_;
          local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        auVar119._8_8_ = 0;
        auVar119._0_8_ = local_fa0;
        auVar135._8_8_ = 0;
        auVar135._0_8_ = local_fe0._32_8_;
        auVar158._8_8_ = 0;
        auVar158._0_8_ = local_fe0._0_8_;
        auVar191._8_8_ = 0;
        auVar191._0_8_ = (double)local_fe0._0_8_ * local_fa0;
        auVar111 = vfnmsub231sd_fma(auVar191,auVar135,auVar119);
        auVar111 = vfnmadd231sd_fma(auVar111,auVar135,auVar158);
        local_dc0._0_8_ =
             (double)local_fe0._24_8_ * (double)local_fe0._24_8_ +
             (double)local_fe0._48_8_ * (double)local_fe0._48_8_ +
             dStack_fa8 * dStack_fa8 + auVar111._0_8_;
        if (local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_1190,
                     (iterator)
                     local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)local_dc0);
        }
        else {
          *local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)local_dc0._0_8_;
          local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        auVar120._8_8_ = 0;
        auVar120._0_8_ = local_fa0;
        auVar136._8_8_ = 0;
        auVar136._0_8_ = local_fe0._32_8_;
        auVar214._8_8_ = 0;
        auVar214._0_8_ = local_fe0._0_8_;
        auVar159._8_8_ = 0;
        auVar159._0_8_ = local_fa0 * (double)local_fe0._32_8_;
        auVar202._8_8_ = 0;
        auVar202._0_8_ =
             (dStack_fa8 + dStack_fa8) * (double)local_fe0._48_8_ * (double)local_fe0._24_8_;
        auVar111 = vfmadd231sd_fma(auVar202,auVar214,auVar159);
        auVar160._8_8_ = 0;
        auVar160._0_8_ = (double)local_fe0._24_8_ * (double)local_fe0._24_8_;
        auVar111 = vfnmadd213sd_fma(auVar160,auVar120,auVar111);
        auVar181._8_8_ = 0;
        auVar181._0_8_ = dStack_fa8 * dStack_fa8;
        auVar111 = vfnmadd213sd_fma(auVar181,auVar214,auVar111);
        auVar121._8_8_ = 0;
        auVar121._0_8_ = (double)local_fe0._48_8_ * (double)local_fe0._48_8_;
        auVar111 = vfnmadd213sd_fma(auVar121,auVar136,auVar111);
        local_dc0._0_8_ = auVar111._0_8_;
        if (local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_1190,
                     (iterator)
                     local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)local_dc0);
        }
        else {
          *local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)local_dc0._0_8_;
          local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        math::o3_roots(&local_718,&local_1190);
        local_8c0._0_8_ = local_fe0;
        local_8c0._16_8_ = local_870;
        local_aa0._8_8_ = local_aa0 + 0x10;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<double,_3,_3,_0,_3,_3> *)local_aa0._8_8_,(SrcXprType *)local_8c0,
              (assign_op<double,_double> *)local_dc0);
        local_dc0._8_8_ =
             -(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0._8_8_)->
              m_storage).m_data.array[1];
        local_dc0._0_8_ =
             -(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0._8_8_)->
              m_storage).m_data.array[0];
        local_dc0._16_8_ =
             -(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0._8_8_)->
              m_storage).m_data.array[2];
        auStack_da8._0_8_ =
             -(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0._8_8_)->
              m_storage).m_data.array[3];
        dStack_d98 = -(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0._8_8_)->
                      m_storage).m_data.array[5];
        auStack_da8._8_8_ =
             -(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0._8_8_)->
              m_storage).m_data.array[4];
        auStack_d90._0_8_ =
             -(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0._8_8_)->
              m_storage).m_data.array[6];
        auStack_d90._8_8_ =
             -(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0._8_8_)->
              m_storage).m_data.array[7];
        auVar233 = _local_dc0;
        dVar108 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_aa0._8_8_)->
                  m_storage).m_data.array[8];
        auVar137._0_8_ = -dVar108;
        auVar137._8_8_ = 0x8000000000000000;
        local_d80 = (double)vmovlpd_avx(auVar137);
        auStack_d78._8_8_ = (assign_op<double,_double> *)local_dc0;
        auStack_d78._0_8_ = local_8c0._16_8_;
        pdStack_d68 = (double *)local_8c0._16_8_;
        local_d60 = 1.48219693752374e-323;
        auVar27._8_8_ = *(double *)local_8c0._16_8_;
        auVar27._0_8_ = *(double *)local_8c0._16_8_;
        auVar111 = vmulpd_avx512vl(local_dc0._0_16_,auVar27);
        auVar28._8_8_ = *(double *)(local_8c0._16_8_ + 8);
        auVar28._0_8_ = *(double *)(local_8c0._16_8_ + 8);
        auVar111 = vfmadd132pd_avx512vl(auStack_da8,auVar111,auVar28);
        auStack_d90 = auVar233._48_16_;
        auVar29._8_8_ = *(double *)(local_8c0._16_8_ + 0x10);
        auVar29._0_8_ = *(double *)(local_8c0._16_8_ + 0x10);
        local_730 = vfmadd132pd_avx512vl(auStack_d90,auVar111,auVar29);
        local_720 = (double)local_dc0._16_8_ * *(double *)local_8c0._16_8_ +
                    (dStack_d98 * *(double *)(local_8c0._16_8_ + 8) -
                    dVar108 * *(double *)(local_8c0._16_8_ + 0x10));
        _local_dc0 = auVar233;
        math::cayley2rot((cayley_t *)local_730);
        auVar111 = stack0xfffffffffffff250;
        auVar111 = vmovhpd_avx(auVar111,dStack_d98);
        lVar109 = 0x10;
        do {
          dVar108 = *(double *)((long)adStack_e78 + lVar109 + 8U);
          auVar203._8_8_ = dVar108;
          auVar203._0_8_ = dVar108;
          uVar1 = *(undefined8 *)
                   ((long)&local_e90.
                           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar109);
          auVar30._8_8_ = uVar1;
          auVar30._0_8_ = uVar1;
          auVar110 = vmulpd_avx512vl(local_dc0._0_16_,auVar30);
          auVar31._8_8_ = *(undefined8 *)((long)adStack_e78 + lVar109);
          auVar31._0_8_ = *(undefined8 *)((long)adStack_e78 + lVar109);
          auVar110 = vfmadd231pd_avx512vl(auVar110,auStack_da8,auVar31);
          auVar110 = vfmadd231pd_fma(auVar110,auStack_d90,auVar203);
          *(undefined1 (*) [16])(auStack_8d0 + lVar109) = auVar110;
          auVar215._0_8_ =
               auVar111._0_8_ *
               *(double *)
                ((long)&local_e90.
                        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar109);
          auVar215._8_8_ = auVar111._8_8_ * *(double *)((long)adStack_e78 + lVar109);
          auVar110 = vshufpd_avx(auVar215,auVar215,1);
          *(double *)(local_8c0 + lVar109) = auVar215._0_8_ + auVar110._0_8_ + dVar108 * local_d80;
          lVar109 = lVar109 + 0x18;
        } while (lVar109 != 0x58);
        math::rot2quaternion(&local_780,(rotation_t *)local_8c0);
        modules::upnp_fill_s(&local_780,(Matrix<double,_10,_1,_0,_10,_1> *)local_aa0);
        auVar63._8_8_ = dStack_ef0;
        auVar63._0_8_ = dStack_ef8;
        auVar59._8_8_ = dStack_f10;
        auVar59._0_8_ = dStack_f18;
        auVar161._8_8_ = dStack_a80;
        auVar161._0_8_ = dStack_a80;
        auVar55._8_8_ = dStack_f30;
        auVar55._0_8_ = dStack_f38;
        auVar52._8_8_ = dStack_f50;
        auVar52._0_8_ = dStack_f58;
        auVar204._8_8_ = dStack_a58;
        auVar204._0_8_ = dStack_a58;
        auVar61._8_8_ = dStack_ef8;
        auVar61._0_8_ = local_f00;
        auVar74._8_8_ = dStack_e98;
        auVar74._0_8_ = local_ea0;
        auVar32._8_8_ = local_aa0._0_8_;
        auVar32._0_8_ = local_aa0._0_8_;
        auVar111 = vmulpd_avx512vl(auVar74,auVar32);
        auVar33._8_8_ = local_aa0._8_8_;
        auVar33._0_8_ = local_aa0._8_8_;
        auVar110 = vfmadd231pd_avx512vl(auVar111,auVar63,auVar33);
        auVar111 = vmovhpd_avx(auVar61,dStack_ee8);
        auVar57._8_8_ = dStack_f18;
        auVar57._0_8_ = local_f20;
        auVar66._8_8_ = dStack_ec8;
        auVar66._0_8_ = local_ed0;
        auVar34._8_8_ = local_aa0._16_8_;
        auVar34._0_8_ = local_aa0._16_8_;
        auVar110 = vfmadd231pd_avx512vl(auVar110,auVar66,auVar34);
        auVar35._8_8_ = pMStack_a88;
        auVar35._0_8_ = pMStack_a88;
        auVar110 = vfmadd231pd_avx512vl(auVar110,auVar59,auVar35);
        auVar69._8_8_ = dStack_eb8;
        auVar69._0_8_ = local_ec0;
        auVar113 = vfmadd231pd_fma(auVar110,auVar161,auVar69);
        auVar110 = vmovhpd_avx(auVar57,dStack_f08);
        auVar138._0_8_ = auVar110._0_8_ * (double)local_aa0._16_8_;
        auVar138._8_8_ = auVar110._8_8_ * (double)pMStack_a88;
        auVar112 = vshufpd_avx(auVar138,auVar138,1);
        auVar36._8_8_ = dStack_a78;
        auVar36._0_8_ = dStack_a78;
        auVar110 = vfmadd231pd_avx512vl(auVar113,auVar55,auVar36);
        auVar72._8_8_ = dStack_ea8;
        auVar72._0_8_ = local_eb0;
        auVar37._8_8_ = dStack_a70;
        auVar37._0_8_ = dStack_a70;
        auVar113 = vfmadd231pd_avx512vl(auVar110,auVar72,auVar37);
        auVar139._8_8_ = 0;
        auVar139._0_8_ = dStack_f28;
        auVar110 = vmovhpd_avx(auVar139,local_f60);
        auVar38._8_8_ = dStack_a68;
        auVar38._0_8_ = dStack_a68;
        auVar113 = vfmadd231pd_avx512vl(auVar113,auVar52,auVar38);
        auVar39._8_8_ = dStack_a60;
        auVar39._0_8_ = dStack_a60;
        auVar113 = vfmadd231pd_avx512vl(auVar113,local_1030,auVar39);
        auVar49._8_8_ = dStack_f70;
        auVar49._0_8_ = dStack_f78;
        auVar193 = vfmadd231pd_fma(auVar113,auVar204,auVar49);
        auVar162._8_8_ = 0;
        auVar162._0_8_ = dStack_f48;
        auVar113 = vmovhpd_avx(auVar162,local_f80);
        auVar163._0_8_ = auVar113._0_8_ * dStack_a68;
        auVar163._8_8_ = auVar113._8_8_ * dStack_a60;
        auVar113 = vshufpd_avx(auVar163,auVar163,1);
        auVar43._8_8_ = dStack_1158;
        auVar43._0_8_ = local_1160;
        auVar193 = vsubpd_avx(auVar193,auVar43);
        dVar108 = (auVar111._0_8_ * (double)local_aa0._0_8_ +
                   auVar111._8_8_ * (double)local_aa0._8_8_ +
                   auVar138._0_8_ + auVar112._0_8_ + dStack_a80 * local_f40 +
                  auVar110._0_8_ * dStack_a78 + auVar110._8_8_ * dStack_a70 +
                  auVar163._0_8_ + auVar113._0_8_ + dStack_a58 * dStack_f68) - local_1150;
        auVar233._8_8_ = local_8c0._8_8_;
        auVar233._0_8_ = local_8c0._0_8_;
        auVar233._16_8_ = local_8c0._16_8_;
        auVar233._24_24_ = local_8c0._24_24_;
        auVar233._48_8_ = dStack_890;
        auVar233._56_8_ = dStack_888;
        _local_dc0 = vpermpd_avx512f(_DAT_001fcc40,auVar233);
        auVar164._8_8_ = 0;
        auVar164._0_8_ = local_880;
        local_d80 = local_880;
        dVar114 = auVar193._0_8_;
        auVar182._0_8_ = dVar114 * (double)local_dc0._0_8_;
        auVar182._8_8_ = dVar114 * (double)local_dc0._8_8_;
        auVar111 = vshufpd_avx(auVar193,auVar193,1);
        auVar110 = vshufpd_avx(auVar193,auVar193,3);
        auVar110 = vfnmsub132pd_fma(auVar110,auVar182,auStack_da8);
        auVar183._8_8_ = dVar108;
        auVar183._0_8_ = dVar108;
        auStack_d78 = vfnmadd132pd_fma(auVar183,auVar110,auStack_d90);
        auVar40._8_8_ = 0x8000000000000000;
        auVar40._0_8_ = 0x8000000000000000;
        auVar110 = vxorpd_avx512vl(auVar164,auVar40);
        pdStack_d68 = (double *)
                      ((dVar108 * auVar110._0_8_ - auVar111._0_8_ * dStack_888) -
                      dVar114 * dStack_890);
        iVar3._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>const&>
                    ((vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                      *)__return_storage_ptr__,iVar3,(Matrix<double,_3,_4,_0,_3,_4> *)local_dc0);
        }
        else {
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[4] = (double)auStack_da8._8_8_;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[5] = dStack_d98;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[6] = (double)auStack_d90._0_8_;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[7] = (double)auStack_d90._8_8_;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[8] = local_880;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[9] = (double)auStack_d78._0_8_;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[10] = (double)auStack_d78._8_8_;
          ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[0xb] = (double)pdStack_d68;
          *(undefined1 (*) [64])
           ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
           m_storage.m_data.array = _local_dc0;
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        if (local_718.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_718.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1190.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar106 = local_8c8 + 1;
      } while (uVar106 < (ulong)((long)local_e00.
                                       super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_e00.
                                       super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 6));
    }
    if ((__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish ==
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      local_fe0._0_8_ =
           ((local_e00.
             super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second).
           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
      local_fe0._8_8_ =
           ((local_e00.
             super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second).
           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
      local_fe0._16_8_ =
           ((local_e00.
             super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second).
           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
      local_fe0._24_8_ =
           ((local_e00.
             super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second).
           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
      modules::upnp_fill_s((Vector4d *)local_fe0,(Matrix<double,_10,_1,_0,_10,_1> *)local_aa0);
      auVar233 = _local_dc0;
      local_dc0._8_8_ = local_dc0 + 0x10;
      auVar140._0_8_ = (double)local_aa0._0_8_ * local_ea0;
      auVar140._8_8_ = (double)local_aa0._0_8_ * dStack_e98;
      auVar165._8_8_ = local_aa0._8_8_;
      auVar165._0_8_ = local_aa0._8_8_;
      auVar64._8_8_ = dStack_ef0;
      auVar64._0_8_ = dStack_ef8;
      auVar111 = vfmadd231pd_fma(auVar140,auVar165,auVar64);
      auVar184._8_8_ = local_aa0._16_8_;
      auVar184._0_8_ = local_aa0._16_8_;
      auVar67._8_8_ = dStack_ec8;
      auVar67._0_8_ = local_ed0;
      auVar111 = vfmadd213pd_fma(auVar67,auVar184,auVar111);
      auVar141._8_8_ = pMStack_a88;
      auVar141._0_8_ = pMStack_a88;
      auVar60._8_8_ = dStack_f10;
      auVar60._0_8_ = dStack_f18;
      auVar111 = vfmadd231pd_fma(auVar111,auVar141,auVar60);
      auVar192._8_8_ = dStack_a80;
      auVar192._0_8_ = dStack_a80;
      auVar70._8_8_ = dStack_eb8;
      auVar70._0_8_ = local_ec0;
      auVar111 = vfmadd213pd_fma(auVar70,auVar192,auVar111);
      auVar205._8_8_ = dStack_a78;
      auVar205._0_8_ = dStack_a78;
      auVar56._8_8_ = dStack_f30;
      auVar56._0_8_ = dStack_f38;
      auVar111 = vfmadd231pd_fma(auVar111,auVar205,auVar56);
      auVar216._8_8_ = dStack_a70;
      auVar216._0_8_ = dStack_a70;
      auVar73._8_8_ = dStack_ea8;
      auVar73._0_8_ = local_eb0;
      auVar111 = vfmadd213pd_fma(auVar73,auVar216,auVar111);
      auVar221._8_8_ = dStack_a68;
      auVar221._0_8_ = dStack_a68;
      auVar53._8_8_ = dStack_f50;
      auVar53._0_8_ = dStack_f58;
      auVar111 = vfmadd231pd_fma(auVar111,auVar221,auVar53);
      auVar225._8_8_ = dStack_a60;
      auVar225._0_8_ = dStack_a60;
      auVar111 = vfmadd213pd_fma(local_1030,auVar225,auVar111);
      auVar229._8_8_ = dStack_a58;
      auVar229._0_8_ = dStack_a58;
      auVar50._8_8_ = dStack_f70;
      auVar50._0_8_ = dStack_f78;
      local_1030 = vfmadd231pd_fma(auVar111,auVar229,auVar50);
      stack0xfffffffffffff260 = auVar233._32_32_;
      stack0xfffffffffffff250 = local_1030;
      dVar108 = (double)local_aa0._0_8_ * local_f00;
      dVar114 = (double)local_aa0._8_8_ * dStack_ee8;
      local_1140._0_8_ = (double)local_aa0._16_8_ * local_f20;
      local_1000 = (double)pMStack_a88 * dStack_f08;
      local_1020._0_8_ = dStack_a80 * local_f40;
      local_e20._0_8_ = dStack_a78 * dStack_f28;
      local_1010 = dStack_a70 * local_f60;
      local_1170 = dStack_a68 * dStack_f48;
      local_dd0[0] = dStack_a60 * local_f80;
      local_de0 = dStack_a58 * dStack_f68;
      dStack_1198 = dStack_1158;
      local_11a0 = (undefined1  [8])local_1160;
      local_ff0 = local_1150;
      math::quaternion2rot((quaternion_t *)local_fe0);
      dVar108 = (dVar114 + dVar108 +
                 (double)local_1020._0_8_ + local_1000 + (double)local_1140._0_8_ +
                local_1010 + (double)local_e20._0_8_ + local_de0 + local_dd0[0] + local_1170) -
                local_ff0;
      auVar110 = vsubpd_avx(local_1030,_local_11a0);
      auVar75._8_8_ = adStack_e78[2];
      auVar75._0_8_ = adStack_e78[1];
      auVar75._16_8_ = adStack_e78[3];
      auVar75._24_16_ = auStack_e58;
      auVar75._40_8_ = dStack_e48;
      auVar75._48_8_ = dStack_e40;
      auVar75._56_8_ = dStack_e38;
      _local_dc0 = vpermpd_avx512f(_DAT_001fcc40,auVar75);
      auVar166._8_8_ = 0;
      auVar166._0_8_ = local_e30;
      local_d80 = local_e30;
      dVar114 = auVar110._0_8_;
      auVar185._0_8_ = dVar114 * (double)local_dc0._0_8_;
      auVar185._8_8_ = dVar114 * (double)local_dc0._8_8_;
      auVar111 = vshufpd_avx(auVar110,auVar110,1);
      auVar110 = vshufpd_avx(auVar110,auVar110,3);
      auVar110 = vfnmsub132pd_fma(auVar110,auVar185,auStack_da8);
      auVar186._8_8_ = dVar108;
      auVar186._0_8_ = dVar108;
      auStack_d78 = vfnmadd132pd_fma(auVar186,auVar110,auStack_d90);
      auVar41._8_8_ = 0x8000000000000000;
      auVar41._0_8_ = 0x8000000000000000;
      auVar110 = vxorpd_avx512vl(auVar166,auVar41);
      pdStack_d68 = (double *)
                    ((dVar108 * auVar110._0_8_ - auVar111._0_8_ * dStack_e38) - dVar114 * dStack_e40
                    );
      iVar3._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>const&>
                  ((vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                    *)__return_storage_ptr__,iVar3,(Matrix<double,_3,_4,_0,_3,_4> *)local_dc0);
      }
      else {
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[4] = (double)auStack_da8._8_8_;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[5] = dStack_d98;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[6] = (double)auStack_d90._0_8_;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[7] = (double)auStack_d90._8_8_;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[8] = local_e30;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[9] = (double)auStack_d78._0_8_;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[10] = (double)auStack_d78._8_8_;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[0xb] = (double)pdStack_d68;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[0] = (double)local_dc0._0_8_;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[1] = (double)local_dc0._8_8_;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[2] = (double)local_dc0._16_8_;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[3] = (double)auStack_da8._0_8_;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[4] = (double)auStack_da8._8_8_;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[5] = dStack_d98;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[6] = (double)auStack_d90._0_8_;
        ((iVar3._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[7] = (double)auStack_d90._8_8_;
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
    }
  }
  if (local_e00.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_e00.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [3]);
  }
  if (local_e90.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_e90.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [3]);
  }
  return __return_storage_ptr__;
}

Assistant:

transformations_t upnp(
    const AbsoluteAdapterBase & adapter,
    const Indices & indices )
{
  assert( indices.size() > 2 );
    
  Eigen::Matrix<double,3,3> F = Eigen::Matrix3d::Zero();
  for( int i = 0; i < (int) indices.size(); i++ )
  {
    Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
    F += f * f.transpose();
  }
  
  Eigen::Matrix<double,3,3> H_inv = (indices.size() * Eigen::Matrix<double,3,3>::Identity()) - F;
  Eigen::Matrix<double,3,3> H = H_inv.inverse();
  
  Eigen::Matrix<double,3,10> I = Eigen::Matrix<double,3,10>::Zero();
  Eigen::Matrix<double,3,1> J = Eigen::Matrix<double,3,1>::Zero();
  Eigen::Matrix<double,3,10> Phi;
  
  for( int i = 0; i < (int) indices.size(); i++ )
  {
    Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
    Eigen::Matrix<double,3,3> Vk = H * ( f * f.transpose() - Eigen::Matrix<double,3,3>::Identity() );
    Eigen::Matrix<double,3,1> p = adapter.getPoint(indices[i]);
    Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[i]);
    
    fill3x10(p,Phi);
    I += Vk * Phi;
    J += Vk * v;
  }
  
  Eigen::Matrix<double,10,10> M = Eigen::Matrix<double,10,10>::Zero();
  Eigen::Matrix<double,1,10>  C = Eigen::Matrix<double,1,10>::Zero();
  double gamma = 0.0;
  
  for(int i = 0; i < (int) indices.size(); i++ )
  {    
    Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
    Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[i]);
    Eigen::Matrix<double,3,1> p = adapter.getPoint(indices[i]);
    
    fill3x10(p,Phi);
    Eigen::Matrix<double,3,3> temp = f*f.transpose() - Eigen::Matrix<double,3,3>::Identity();
    Eigen::Matrix<double,3,10> Ai =  temp * (Phi + I);
    Eigen::Matrix<double,3, 1> bi = -temp * (  v + J);
    
    M     += (Ai.transpose() * Ai);
    C     += (bi.transpose() * Ai);
    gamma += (bi.transpose() * bi);
  }
  
  //now do the main computation
  std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > quaternions1;
  if( indices.size() > 4 )
    modules::upnp_main_sym( M, C, gamma, quaternions1 );
  else
    modules::upnp_main( M, C, gamma, quaternions1 );
  
  //prepare the output vector
  transformations_t transformations;
  
  //Round 1: chirality check
  std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > quaternions2;
  for( int i = 0; i < quaternions1.size(); i++ )
  {
    rotation_t Rinv = math::quaternion2rot(quaternions1[i].second);
    
    Eigen::Matrix<double,10,1> s;
    modules::upnp_fill_s( quaternions1[i].second, s );
    translation_t tinv = I*s - J;
    
    if( transformations.size() == 0 )
    {
      transformation_t newTransformation;
      newTransformation.block<3,3>(0,0) = Rinv.transpose();
      newTransformation.block<3,1>(0,3) = -newTransformation.block<3,3>(0,0) * tinv;
      transformations.push_back(newTransformation);
    }
    
    int count_negative = 0;
    
    for( int j = 0; j < (int) indices.size(); j++ )
    {
      Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[j]) * adapter.getBearingVector(indices[j]);
      Eigen::Matrix<double,3,1> p = adapter.getPoint(indices[j]);
      Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[j]);
      
      Eigen::Vector3d p_est = Rinv*p + tinv - v;
      
      if( p_est.transpose()*f < 0.0 )
        count_negative++;
    }
    
    if( count_negative < floor(0.2 * indices.size() + 0.5) )
      quaternions2.push_back(quaternions1[i]);
  }
  
  if( quaternions2.size() == 0 )
    return transformations;
  else
    transformations.clear();
  
  //Round 2: Second order optimality (plus polishing)
  Eigen::Matrix<double,3,10> I_cay;
  Eigen::Matrix<double,10,10> M_cay;
  Eigen::Matrix<double,1,10>  C_cay;
  double gamma_cay;
  
  for( size_t q = 0; q < quaternions2.size(); q++ )
  {    
    I_cay = Eigen::Matrix<double,3,10>::Zero();
    rotation_t Rinv = math::quaternion2rot(quaternions2[q].second);
    
    for( int i = 0; i < (int) indices.size(); i++ )
    {
      Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
      Eigen::Matrix<double,3,3> Vk = H * ( f * f.transpose() - Eigen::Matrix<double,3,3>::Identity() );
      Eigen::Matrix<double,3,1> p = Rinv * adapter.getPoint(indices[i]);
      
      fill3x10(p,Phi);
      I_cay += Vk * Phi;
    }
    
    M_cay = Eigen::Matrix<double,10,10>::Zero();
    C_cay = Eigen::Matrix<double,1,10>::Zero();
    gamma_cay = 0.0;
    
    for(int i = 0; i < (int) indices.size(); i++ )
    {    
      Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
      Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[i]);
      Eigen::Matrix<double,3,1> p = Rinv * adapter.getPoint(indices[i]);
      
      fill3x10(p,Phi);
      Eigen::Matrix<double,3,3> temp = f*f.transpose() - Eigen::Matrix<double,3,3>::Identity();
      Eigen::Matrix<double,3,10> Ai =  temp * (Phi + I_cay);
      Eigen::Matrix<double,3,1> bi = -temp * (  v + J);
      
      M_cay     += (Ai.transpose() * Ai);
      C_cay     += (bi.transpose() * Ai);
      gamma_cay += (bi.transpose() * bi);
    }
    
    //now analyze the eigenvalues of the "Hessian"
    Eigen::Vector3d val;
    Eigen::Matrix3d Jacobian;
    f( M_cay, C_cay, gamma_cay, val );
    Jac( M_cay, C_cay, gamma_cay, Jacobian );
    std::vector<double> characteristicPolynomial;
    characteristicPolynomial.push_back(-1.0);
    characteristicPolynomial.push_back(Jacobian(2,2)+Jacobian(1,1)+Jacobian(0,0));
    characteristicPolynomial.push_back(-Jacobian(2,2)*Jacobian(1,1)-Jacobian(2,2)*Jacobian(0,0)-Jacobian(1,1)*Jacobian(0,0)+pow(Jacobian(1,2),2)+pow(Jacobian(0,2),2)+pow(Jacobian(0,1),2));
    characteristicPolynomial.push_back(Jacobian(2,2)*Jacobian(1,1)*Jacobian(0,0)+2*Jacobian(1,2)*Jacobian(0,2)*Jacobian(0,1)-Jacobian(2,2)*pow(Jacobian(0,1),2)-pow(Jacobian(1,2),2)*Jacobian(0,0)-Jacobian(1,1)*pow(Jacobian(0,2),2));
    std::vector<double> roots = opengv::math::o3_roots( characteristicPolynomial );
    
    bool allPositive = true;
    for( size_t i = 0; i < roots.size(); i++ )
    {
      if( roots[i] < 0.0 )
      {
        allPositive = false;
        break;
      }
    }
    
    if( true )//allPositive)//use all results for the moment
    {
      //perform the polishing step
      Eigen::Vector3d cay = - Jacobian.inverse() * val;
      rotation_t Rinv2 = math::cayley2rot(cay) * Rinv;
      quaternion_t q = math::rot2quaternion(Rinv2);
      
      Eigen::Matrix<double,10,1> s;
      modules::upnp_fill_s(q,s);
      translation_t tinv = I*s - J;
      
      transformation_t newTransformation;
      newTransformation.block<3,3>(0,0) = Rinv2.transpose();
      newTransformation.block<3,1>(0,3) = -newTransformation.block<3,3>(0,0) * tinv;
      transformations.push_back(newTransformation);
    }
  }
  
  //if there are no results, simply add the one with lowest score
  if( transformations.size() == 0 )
  {
    Eigen::Vector4d q = quaternions2[0].second;
    Eigen::Matrix<double,10,1> s;
    modules::upnp_fill_s(q,s);
    translation_t tinv = I*s - J;
    rotation_t Rinv = math::quaternion2rot(q);
    
    transformation_t newTransformation;
    newTransformation.block<3,3>(0,0) = Rinv.transpose();
    newTransformation.block<3,1>(0,3) = -newTransformation.block<3,3>(0,0) * tinv;
    transformations.push_back(newTransformation);
  }
  
  return transformations;
}